

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_avx::forward
          (Convolution1D_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  int iVar3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  void *pvVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int *piVar25;
  void *pvVar26;
  int iVar27;
  uint _h;
  int iVar28;
  long lVar29;
  uint uVar30;
  float *pfVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  float *pfVar35;
  ulong uVar36;
  undefined1 (*pauVar37) [16];
  undefined1 (*pauVar38) [32];
  ulong uVar39;
  int iVar40;
  ulong uVar41;
  int iVar42;
  float *pfVar43;
  long lVar44;
  bool bVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar86 [64];
  undefined1 auVar117 [28];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar184;
  float fVar188;
  float fVar189;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar176 [32];
  float fVar190;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar183;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 in_ZMM3 [64];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar208 [16];
  float fVar207;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar250;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar248;
  float fVar249;
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 in_ZMM7 [64];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [64];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar290 [32];
  float fVar298;
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  Mat bottom_blob_bordered;
  ulong local_110;
  uint local_e0;
  Mat local_b8;
  long local_68;
  void *local_60;
  ulong local_58;
  ulong local_50;
  undefined1 local_48 [16];
  undefined1 auVar172 [32];
  undefined1 auVar175 [32];
  undefined1 auVar177 [32];
  undefined1 auVar180 [32];
  undefined1 auVar237 [32];
  undefined1 auVar242 [32];
  undefined1 auVar247 [32];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  
  uVar39 = bottom_blob->elemsize;
  uVar2 = bottom_blob->elempack;
  p_Var4 = this->_vptr_Convolution1D_x86_avx[-3];
  iVar3 = *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar42 = *(int *)(&this->field_0xd8 + (long)p_Var4);
  local_b8.cstep = 0;
  local_b8.data = (Allocator *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_b8.elempack = 0;
  local_b8.h = 0;
  local_b8.allocator = (Allocator *)local_b8.data;
  local_b8.dims = (int)local_b8.refcount;
  local_b8.w = local_b8.refcount._4_4_;
  local_b8.d = (int)local_b8.refcount;
  local_b8.c = local_b8.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)
             ((long)&this->_vptr_Convolution1D_x86_avx + (long)this->_vptr_Convolution1D_x86_avx[-3]
             ),bottom_blob,&local_b8,opt);
  iVar27 = local_b8.h;
  iVar40 = -100;
  if (((Allocator *)local_b8.data != (Allocator *)0x0) && ((long)local_b8.c * local_b8.cstep != 0))
  {
    lVar29 = 1;
    if (opt->use_packing_layout == true) {
      lVar29 = 8;
      if ((*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3]) & 7) != 0) {
        lVar29 = (ulong)((*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3])
                         & 3) == 0) * 3 + 1;
      }
    }
    uVar41 = (ulong)(uint)local_b8.h;
    uVar33 = (uint)lVar29;
    iVar3 = (local_b8.w + ~((iVar3 + -1) * iVar42)) /
            *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx[-3]);
    local_50 = (ulong)(iVar3 + 1U);
    _h = *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3]) / (int)uVar33;
    Mat::create(top_blob,iVar3 + 1U,_h,lVar29 * (uVar39 / (ulong)(long)(int)uVar2),uVar33,
                opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar32 = uVar2 ^ 8;
      local_e0 = uVar33 ^ 8;
      if ((uVar33 == 8 && uVar32 == 0) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_110 = 0;
        auVar264 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar206._8_4_ = 0x3f000000;
        auVar206._0_8_ = 0x3f0000003f000000;
        auVar206._12_4_ = 0x3f000000;
        auVar206._16_4_ = 0x3f000000;
        auVar206._20_4_ = 0x3f000000;
        auVar206._24_4_ = 0x3f000000;
        auVar206._28_4_ = 0x3f000000;
        auVar86 = ZEXT3264(CONCAT428(0x3f800000,
                                     CONCAT424(0x3f800000,
                                               CONCAT420(0x3f800000,
                                                         CONCAT416(0x3f800000,
                                                                   CONCAT412(0x3f800000,
                                                                             CONCAT48(0x3f800000,
                                                                                                                                                                            
                                                  0x3f8000003f800000)))))));
        do {
          if (-1 < iVar3) {
            pauVar38 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_110 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar40 = 0;
            iVar42 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar274 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar274 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                     local_110 * 0x20));
              }
              if (0 < iVar27) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * local_110 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                pfVar35 = (float *)((long)&((Allocator *)((long)local_b8.data + 0x18))->
                                           _vptr_Allocator +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar40) * 4 +
                                   4);
                uVar39 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar31 = pfVar35;
                    iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      fVar46 = pfVar31[-7];
                      fVar60 = pfVar31[-6];
                      fVar87 = pfVar31[-5];
                      fVar88 = pfVar31[-4];
                      fVar190 = pfVar31[-3];
                      fVar89 = pfVar31[-2];
                      fVar187 = pfVar31[-1];
                      fVar189 = *pfVar31;
                      in_ZMM7 = ZEXT3264(CONCAT428(fVar88,CONCAT424(fVar89 * pfVar43[0x2e],
                                                                    CONCAT420(fVar89 * pfVar43[0x2d]
                                                                              ,CONCAT416(fVar89 * 
                                                  pfVar43[0x2c],
                                                  CONCAT412(fVar89 * pfVar43[0x2b],
                                                            CONCAT48(fVar89 * pfVar43[0x2a],
                                                                     CONCAT44(fVar89 * pfVar43[0x29]
                                                                              ,fVar89 * pfVar43[0x28
                                                  ]))))))));
                      fVar188 = fVar60 + fVar87 + fVar87 + fVar88;
                      fVar135 = fVar187 * pfVar43[0x30] + fVar189 * pfVar43[0x38];
                      fVar182 = fVar187 * pfVar43[0x31] + fVar189 * pfVar43[0x39];
                      fVar183 = fVar187 * pfVar43[0x32] + fVar189 * pfVar43[0x3a];
                      fVar184 = fVar187 * pfVar43[0x33] + fVar189 * pfVar43[0x3b];
                      fVar185 = fVar187 * pfVar43[0x34] + fVar189 * pfVar43[0x3c];
                      fVar186 = fVar187 * pfVar43[0x35] + fVar189 * pfVar43[0x3d];
                      fVar187 = fVar187 * pfVar43[0x36] + fVar189 * pfVar43[0x3e];
                      fVar189 = fVar87 + fVar188;
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar189,CONCAT424(fVar187,CONCAT420(fVar186,
                                                  CONCAT416(fVar185,CONCAT412(fVar184,CONCAT48(
                                                  fVar183,CONCAT44(fVar182,fVar135))))))));
                      auVar274 = ZEXT3264(CONCAT428(auVar274._28_4_ + fVar46 + fVar60 + fVar87 +
                                                    fVar188 + fVar189,
                                                    CONCAT424(auVar274._24_4_ + fVar46 * pfVar43[6]
                                                              + fVar60 * pfVar43[0xe] +
                                                                fVar87 * pfVar43[0x16] +
                                                              fVar88 * pfVar43[0x1e] +
                                                              fVar190 * pfVar43[0x26] +
                                                              fVar89 * pfVar43[0x2e] + fVar187,
                                                              CONCAT420(auVar274._20_4_ +
                                                                        fVar46 * pfVar43[5] +
                                                                        fVar60 * pfVar43[0xd] +
                                                                        fVar87 * pfVar43[0x15] +
                                                                        fVar88 * pfVar43[0x1d] +
                                                                        fVar190 * pfVar43[0x25] +
                                                                        fVar89 * pfVar43[0x2d] +
                                                                        fVar186,CONCAT416(auVar274.
                                                  _16_4_ + fVar46 * pfVar43[4] +
                                                  fVar60 * pfVar43[0xc] + fVar87 * pfVar43[0x14] +
                                                  fVar88 * pfVar43[0x1c] + fVar190 * pfVar43[0x24] +
                                                  fVar89 * pfVar43[0x2c] + fVar185,
                                                  CONCAT412(auVar274._12_4_ + fVar46 * pfVar43[3] +
                                                            fVar60 * pfVar43[0xb] +
                                                            fVar87 * pfVar43[0x13] +
                                                            fVar88 * pfVar43[0x1b] +
                                                            fVar190 * pfVar43[0x23] +
                                                            fVar89 * pfVar43[0x2b] + fVar184,
                                                            CONCAT48(auVar274._8_4_ +
                                                                     fVar46 * pfVar43[2] +
                                                                     fVar60 * pfVar43[10] +
                                                                     fVar87 * pfVar43[0x12] +
                                                                     fVar88 * pfVar43[0x1a] +
                                                                     fVar190 * pfVar43[0x22] +
                                                                     fVar89 * pfVar43[0x2a] +
                                                                     fVar183,CONCAT44(auVar274._4_4_
                                                                                      + fVar46 * 
                                                  pfVar43[1] +
                                                  fVar60 * pfVar43[9] + fVar87 * pfVar43[0x11] +
                                                  fVar88 * pfVar43[0x19] + fVar190 * pfVar43[0x21] +
                                                  fVar89 * pfVar43[0x29] + fVar182,
                                                  auVar274._0_4_ + fVar46 * *pfVar43 +
                                                  fVar60 * pfVar43[8] + fVar87 * pfVar43[0x10] +
                                                  fVar88 * pfVar43[0x18] + fVar190 * pfVar43[0x20] +
                                                  fVar89 * pfVar43[0x28] + fVar135))))))));
                      pfVar43 = pfVar43 + 0x40;
                      pfVar31 = pfVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 3);
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  uVar39 = uVar39 + 1;
                  pfVar35 = (float *)((long)pfVar35 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar39 != uVar41);
              }
              auVar269 = auVar274._0_32_;
              p_Var4 = pp_Var5[-3];
              auVar53 = auVar264._0_32_;
              fVar135 = auVar274._8_4_;
              fVar182 = auVar274._12_4_;
              fVar183 = auVar274._16_4_;
              fVar184 = auVar274._20_4_;
              fVar185 = auVar274._24_4_;
              auVar79 = auVar86._0_32_;
              fVar46 = auVar86._0_4_;
              fVar60 = auVar86._4_4_;
              fVar87 = auVar86._8_4_;
              fVar88 = auVar86._12_4_;
              fVar190 = auVar86._16_4_;
              fVar89 = auVar86._20_4_;
              fVar187 = auVar86._24_4_;
              fVar189 = auVar86._28_4_;
              auVar275._28_36_ = auVar274._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar269 = vmaxps_avx(auVar269,auVar53);
                break;
              case 2:
                auVar79 = vmaxps_avx(auVar269,auVar53);
                in_ZMM7 = ZEXT3264(auVar79);
                auVar53 = vminps_avx(auVar269,auVar53);
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar269._0_4_ = fVar46 * auVar53._0_4_ + auVar79._0_4_;
                auVar269._4_4_ = fVar46 * auVar53._4_4_ + auVar79._4_4_;
                auVar269._8_4_ = fVar46 * auVar53._8_4_ + auVar79._8_4_;
                auVar269._12_4_ = fVar46 * auVar53._12_4_ + auVar79._12_4_;
                auVar269._16_4_ = fVar46 * auVar53._16_4_ + auVar79._16_4_;
                auVar269._20_4_ = fVar46 * auVar53._20_4_ + auVar79._20_4_;
                auVar269._24_4_ = fVar46 * auVar53._24_4_ + auVar79._24_4_;
                auVar269._28_4_ = auVar53._28_4_ + auVar79._28_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar235._4_4_ = uVar1;
                auVar235._0_4_ = uVar1;
                auVar235._8_4_ = uVar1;
                auVar235._12_4_ = uVar1;
                auVar235._16_4_ = uVar1;
                auVar235._20_4_ = uVar1;
                auVar235._24_4_ = uVar1;
                auVar235._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar290._4_4_ = uVar1;
                auVar290._0_4_ = uVar1;
                auVar290._8_4_ = uVar1;
                auVar290._12_4_ = uVar1;
                auVar290._16_4_ = uVar1;
                auVar290._20_4_ = uVar1;
                auVar290._24_4_ = uVar1;
                auVar290._28_4_ = uVar1;
                auVar269 = vmaxps_avx(auVar269,auVar235);
                in_ZMM7 = ZEXT3264(auVar269);
                auVar269 = vminps_avx(auVar290,auVar269);
                break;
              case 4:
                auVar236._0_8_ = auVar274._0_8_ ^ 0x8000000080000000;
                auVar236._8_4_ = -fVar135;
                auVar236._12_4_ = -fVar182;
                auVar236._16_4_ = -fVar183;
                auVar236._20_4_ = -fVar184;
                auVar236._24_4_ = -fVar185;
                auVar236._28_4_ = -auVar274._28_4_;
                auVar123._8_4_ = 0x42b0c0a5;
                auVar123._0_8_ = 0x42b0c0a542b0c0a5;
                auVar123._12_4_ = 0x42b0c0a5;
                auVar123._16_4_ = 0x42b0c0a5;
                auVar123._20_4_ = 0x42b0c0a5;
                auVar123._24_4_ = 0x42b0c0a5;
                auVar123._28_4_ = 0x42b0c0a5;
                auVar269 = vminps_avx(auVar236,auVar123);
                auVar124._8_4_ = 0xc2b0c0a5;
                auVar124._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar124._12_4_ = 0xc2b0c0a5;
                auVar124._16_4_ = 0xc2b0c0a5;
                auVar124._20_4_ = 0xc2b0c0a5;
                auVar124._24_4_ = 0xc2b0c0a5;
                auVar124._28_4_ = 0xc2b0c0a5;
                auVar53 = vmaxps_avx(auVar269,auVar124);
                auVar268._0_4_ = auVar53._0_4_ * 1.442695 + 0.5;
                auVar268._4_4_ = auVar53._4_4_ * 1.442695 + 0.5;
                auVar268._8_4_ = auVar53._8_4_ * 1.442695 + 0.5;
                auVar268._12_4_ = auVar53._12_4_ * 1.442695 + 0.5;
                auVar268._16_4_ = auVar53._16_4_ * 1.442695 + 0.5;
                auVar268._20_4_ = auVar53._20_4_ * 1.442695 + 0.5;
                auVar268._24_4_ = auVar53._24_4_ * 1.442695 + 0.5;
                auVar268._28_4_ = auVar274._28_4_ + 0.5;
                auVar126 = vroundps_avx(auVar268,1);
                auVar269 = vcmpps_avx(auVar268,auVar126,1);
                auVar269 = vandps_avx(auVar269,auVar79);
                auVar269 = vsubps_avx(auVar126,auVar269);
                fVar135 = auVar269._0_4_ * -0.6931472 + auVar53._0_4_;
                fVar182 = auVar269._4_4_ * -0.6931472 + auVar53._4_4_;
                fVar183 = auVar269._8_4_ * -0.6931472 + auVar53._8_4_;
                fVar184 = auVar269._12_4_ * -0.6931472 + auVar53._12_4_;
                fVar185 = auVar269._16_4_ * -0.6931472 + auVar53._16_4_;
                fVar186 = auVar269._20_4_ * -0.6931472 + auVar53._20_4_;
                fVar188 = auVar269._24_4_ * -0.6931472 + auVar53._24_4_;
                in_ZMM3 = ZEXT3264(CONCAT428(0x3ab743ce,
                                             CONCAT424(0x3ab743ce,
                                                       CONCAT420(0x3ab743ce,
                                                                 CONCAT416(0x3ab743ce,
                                                                           CONCAT412(0x3ab743ce,
                                                                                     CONCAT48(
                                                  0x3ab743ce,0x3ab743ce3ab743ce)))))));
                auVar209._0_4_ = (int)auVar269._0_4_;
                auVar209._4_4_ = (int)auVar269._4_4_;
                auVar209._8_4_ = (int)auVar269._8_4_;
                auVar209._12_4_ = (int)auVar269._12_4_;
                auVar237._16_4_ = (int)auVar269._16_4_;
                auVar237._0_16_ = auVar209;
                auVar237._20_4_ = (int)auVar269._20_4_;
                auVar237._24_4_ = (int)auVar269._24_4_;
                auVar237._28_4_ = (int)auVar269._28_4_;
                auVar208 = vpslld_avx(auVar209,0x17);
                auVar136 = vpslld_avx(auVar237._16_16_,0x17);
                auVar47._8_4_ = 0x3f800000;
                auVar47._0_8_ = 0x3f8000003f800000;
                auVar47._12_4_ = 0x3f800000;
                auVar136 = vpaddd_avx(auVar136,auVar47);
                auVar208 = vpaddd_avx(auVar208,auVar47);
                auVar125._0_4_ =
                     (fVar135 + fVar46 +
                     fVar135 * fVar135 *
                     (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135
                       + 0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5)) * auVar208._0_4_ +
                     fVar46;
                auVar125._4_4_ =
                     (fVar182 + fVar60 +
                     fVar182 * fVar182 *
                     (((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182
                       + 0.041665796) * fVar182 + 0.16666666) * fVar182 + 0.5)) * auVar208._4_4_ +
                     fVar60;
                auVar125._8_4_ =
                     (fVar183 + fVar87 +
                     fVar183 * fVar183 *
                     (((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452) * fVar183
                       + 0.041665796) * fVar183 + 0.16666666) * fVar183 + 0.5)) * auVar208._8_4_ +
                     fVar87;
                auVar125._12_4_ =
                     (fVar184 + fVar88 +
                     fVar184 * fVar184 *
                     (((((fVar184 * 0.00019875691 + 0.0013981999) * fVar184 + 0.008333452) * fVar184
                       + 0.041665796) * fVar184 + 0.16666666) * fVar184 + 0.5)) * auVar208._12_4_ +
                     fVar88;
                auVar125._16_4_ =
                     (fVar185 + fVar190 +
                     fVar185 * fVar185 *
                     (((((fVar185 * 0.00019875691 + 0.0013981999) * fVar185 + 0.008333452) * fVar185
                       + 0.041665796) * fVar185 + 0.16666666) * fVar185 + 0.5)) * auVar136._0_4_ +
                     fVar190;
                auVar125._20_4_ =
                     (fVar186 + fVar89 +
                     fVar186 * fVar186 *
                     (((((fVar186 * 0.00019875691 + 0.0013981999) * fVar186 + 0.008333452) * fVar186
                       + 0.041665796) * fVar186 + 0.16666666) * fVar186 + 0.5)) * auVar136._4_4_ +
                     fVar89;
                auVar125._24_4_ =
                     (fVar188 + fVar187 +
                     fVar188 * fVar188 *
                     (((((fVar188 * 0.00019875691 + 0.0013981999) * fVar188 + 0.008333452) * fVar188
                       + 0.041665796) * fVar188 + 0.16666666) * fVar188 + 0.5)) * auVar136._8_4_ +
                     fVar187;
                auVar125._28_4_ = auVar126._28_4_ + auVar53._28_4_ + fVar189 + 0.71826285 + fVar189;
                auVar53 = vrcpps_avx(auVar125);
                in_ZMM7 = ZEXT3264(auVar53);
                fVar46 = auVar53._0_4_;
                fVar60 = auVar53._4_4_;
                auVar14._4_4_ = auVar125._4_4_ * fVar60;
                auVar14._0_4_ = auVar125._0_4_ * fVar46;
                fVar87 = auVar53._8_4_;
                auVar14._8_4_ = auVar125._8_4_ * fVar87;
                fVar88 = auVar53._12_4_;
                auVar14._12_4_ = auVar125._12_4_ * fVar88;
                fVar190 = auVar53._16_4_;
                auVar14._16_4_ = auVar125._16_4_ * fVar190;
                fVar89 = auVar53._20_4_;
                auVar14._20_4_ = auVar125._20_4_ * fVar89;
                fVar187 = auVar53._24_4_;
                auVar14._24_4_ = auVar125._24_4_ * fVar187;
                auVar14._28_4_ = auVar125._28_4_;
                auVar79 = vsubps_avx(auVar79,auVar14);
                auVar269._0_4_ = fVar46 + fVar46 * auVar79._0_4_;
                auVar269._4_4_ = fVar60 + fVar60 * auVar79._4_4_;
                auVar269._8_4_ = fVar87 + fVar87 * auVar79._8_4_;
                auVar269._12_4_ = fVar88 + fVar88 * auVar79._12_4_;
                auVar269._16_4_ = fVar190 + fVar190 * auVar79._16_4_;
                auVar269._20_4_ = fVar89 + fVar89 * auVar79._20_4_;
                auVar269._24_4_ = fVar187 + fVar187 * auVar79._24_4_;
                auVar269._28_4_ = auVar53._28_4_ + auVar79._28_4_;
                break;
              case 5:
                auVar258._8_4_ = 0x42b0c0a5;
                auVar258._0_8_ = 0x42b0c0a542b0c0a5;
                auVar258._12_4_ = 0x42b0c0a5;
                auVar258._16_4_ = 0x42b0c0a5;
                auVar258._20_4_ = 0x42b0c0a5;
                auVar258._24_4_ = 0x42b0c0a5;
                auVar258._28_4_ = 0x42b0c0a5;
                auVar269 = vminps_avx(auVar269,auVar258);
                auVar261._8_4_ = 0xc2b0c0a5;
                auVar261._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar261._12_4_ = 0xc2b0c0a5;
                auVar261._16_4_ = 0xc2b0c0a5;
                auVar261._20_4_ = 0xc2b0c0a5;
                auVar261._24_4_ = 0xc2b0c0a5;
                auVar261._28_4_ = 0xc2b0c0a5;
                auVar53 = vmaxps_avx(auVar261,auVar269);
                auVar233._0_4_ = auVar53._0_4_ * 1.442695 + 0.5;
                auVar233._4_4_ = auVar53._4_4_ * 1.442695 + 0.5;
                auVar233._8_4_ = auVar53._8_4_ * 1.442695 + 0.5;
                auVar233._12_4_ = auVar53._12_4_ * 1.442695 + 0.5;
                auVar233._16_4_ = auVar53._16_4_ * 1.442695 + 0.5;
                auVar233._20_4_ = auVar53._20_4_ * 1.442695 + 0.5;
                auVar233._24_4_ = auVar53._24_4_ * 1.442695 + 0.5;
                auVar233._28_4_ = in_ZMM7._28_4_ + 0.5;
                auVar126 = vroundps_avx(auVar233,1);
                auVar269 = vcmpps_avx(auVar233,auVar126,1);
                auVar269 = vandps_avx(auVar269,auVar79);
                auVar269 = vsubps_avx(auVar126,auVar269);
                auVar11._4_4_ = auVar269._4_4_ * 0.6931472;
                auVar11._0_4_ = auVar269._0_4_ * 0.6931472;
                auVar11._8_4_ = auVar269._8_4_ * 0.6931472;
                auVar11._12_4_ = auVar269._12_4_ * 0.6931472;
                auVar11._16_4_ = auVar269._16_4_ * 0.6931472;
                auVar11._20_4_ = auVar269._20_4_ * 0.6931472;
                auVar11._24_4_ = auVar269._24_4_ * 0.6931472;
                auVar11._28_4_ = auVar126._28_4_;
                auVar53 = vsubps_avx(auVar53,auVar11);
                fVar186 = auVar53._0_4_;
                fVar188 = auVar53._4_4_;
                fVar293 = auVar53._8_4_;
                fVar294 = auVar53._12_4_;
                fVar295 = auVar53._16_4_;
                fVar296 = auVar53._20_4_;
                fVar297 = auVar53._24_4_;
                auVar136._0_4_ = (int)auVar269._0_4_;
                auVar136._4_4_ = (int)auVar269._4_4_;
                auVar136._8_4_ = (int)auVar269._8_4_;
                auVar136._12_4_ = (int)auVar269._12_4_;
                auVar165._16_4_ = (int)auVar269._16_4_;
                auVar165._0_16_ = auVar136;
                auVar165._20_4_ = (int)auVar269._20_4_;
                auVar165._24_4_ = (int)auVar269._24_4_;
                auVar165._28_4_ = (int)auVar269._28_4_;
                auVar208 = vpslld_avx(auVar136,0x17);
                auVar136 = vpslld_avx(auVar165._16_16_,0x17);
                auVar199._8_4_ = 0x3f800000;
                auVar199._0_8_ = 0x3f8000003f800000;
                auVar199._12_4_ = 0x3f800000;
                auVar136 = vpaddd_avx(auVar136,auVar199);
                auVar208 = vpaddd_avx(auVar208,auVar199);
                auVar234._0_4_ =
                     (fVar186 + fVar46 +
                     fVar186 * fVar186 *
                     (((((fVar186 * 0.00019875691 + 0.0013981999) * fVar186 + 0.008333452) * fVar186
                       + 0.041665796) * fVar186 + 0.16666666) * fVar186 + 0.5)) * auVar208._0_4_ +
                     fVar46;
                auVar234._4_4_ =
                     (fVar188 + fVar60 +
                     fVar188 * fVar188 *
                     (((((fVar188 * 0.00019875691 + 0.0013981999) * fVar188 + 0.008333452) * fVar188
                       + 0.041665796) * fVar188 + 0.16666666) * fVar188 + 0.5)) * auVar208._4_4_ +
                     fVar60;
                auVar234._8_4_ =
                     (fVar293 + fVar87 +
                     fVar293 * fVar293 *
                     (((((fVar293 * 0.00019875691 + 0.0013981999) * fVar293 + 0.008333452) * fVar293
                       + 0.041665796) * fVar293 + 0.16666666) * fVar293 + 0.5)) * auVar208._8_4_ +
                     fVar87;
                auVar234._12_4_ =
                     (fVar294 + fVar88 +
                     fVar294 * fVar294 *
                     (((((fVar294 * 0.00019875691 + 0.0013981999) * fVar294 + 0.008333452) * fVar294
                       + 0.041665796) * fVar294 + 0.16666666) * fVar294 + 0.5)) * auVar208._12_4_ +
                     fVar88;
                auVar234._16_4_ =
                     (fVar295 + fVar190 +
                     fVar295 * fVar295 *
                     (((((fVar295 * 0.00019875691 + 0.0013981999) * fVar295 + 0.008333452) * fVar295
                       + 0.041665796) * fVar295 + 0.16666666) * fVar295 + 0.5)) * auVar136._0_4_ +
                     fVar190;
                auVar234._20_4_ =
                     (fVar296 + fVar89 +
                     fVar296 * fVar296 *
                     (((((fVar296 * 0.00019875691 + 0.0013981999) * fVar296 + 0.008333452) * fVar296
                       + 0.041665796) * fVar296 + 0.16666666) * fVar296 + 0.5)) * auVar136._4_4_ +
                     fVar89;
                auVar234._24_4_ =
                     (fVar297 + fVar187 +
                     fVar297 * fVar297 *
                     (((((fVar297 * 0.00019875691 + 0.0013981999) * fVar297 + 0.008333452) * fVar297
                       + 0.041665796) * fVar297 + 0.16666666) * fVar297 + 0.5)) * auVar136._8_4_ +
                     fVar187;
                auVar234._28_4_ =
                     auVar53._28_4_ + fVar189 +
                     in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 +
                     fVar189;
                auVar120._8_4_ = 0x800000;
                auVar120._0_8_ = 0x80000000800000;
                auVar120._12_4_ = 0x800000;
                auVar120._16_4_ = 0x800000;
                auVar120._20_4_ = 0x800000;
                auVar120._24_4_ = 0x800000;
                auVar120._28_4_ = 0x800000;
                auVar126 = vmaxps_avx(auVar234,auVar120);
                auVar136 = vpsrld_avx(auVar126._16_16_,0x17);
                auVar197._8_4_ = 0x807fffff;
                auVar197._0_8_ = 0x807fffff807fffff;
                auVar197._12_4_ = 0x807fffff;
                auVar197._16_4_ = 0x807fffff;
                auVar197._20_4_ = 0x807fffff;
                auVar197._24_4_ = 0x807fffff;
                auVar197._28_4_ = 0x807fffff;
                auVar269 = vandps_avx(auVar126,auVar197);
                auVar171 = vorps_avx(auVar269,auVar206);
                auVar198._8_4_ = 0x3f3504f3;
                auVar198._0_8_ = 0x3f3504f33f3504f3;
                auVar198._12_4_ = 0x3f3504f3;
                auVar198._16_4_ = 0x3f3504f3;
                auVar198._20_4_ = 0x3f3504f3;
                auVar198._24_4_ = 0x3f3504f3;
                auVar198._28_4_ = 0x3f3504f3;
                auVar53 = vcmpps_avx(auVar198,auVar171,2);
                auVar269 = vandnps_avx(auVar53,auVar171);
                fVar186 = auVar171._0_4_ + -1.0 + auVar269._0_4_;
                fVar188 = auVar171._4_4_ + -1.0 + auVar269._4_4_;
                fVar293 = auVar171._8_4_ + -1.0 + auVar269._8_4_;
                fVar294 = auVar171._12_4_ + -1.0 + auVar269._12_4_;
                fVar295 = auVar171._16_4_ + -1.0 + auVar269._16_4_;
                fVar296 = auVar171._20_4_ + -1.0 + auVar269._20_4_;
                fVar297 = auVar171._24_4_ + -1.0 + auVar269._24_4_;
                auVar136 = vpsubd_avx(auVar136,auVar53._16_16_);
                auVar208 = vpsrld_avx(auVar126._0_16_,0x17);
                auVar254._8_4_ = 0xffffff81;
                auVar254._0_8_ = 0xffffff81ffffff81;
                auVar254._12_4_ = 0xffffff81;
                auVar136 = vpaddd_avx(auVar254,auVar136);
                auVar208 = vpsubd_avx(auVar208,auVar53._0_16_);
                auVar208 = vpaddd_avx(auVar254,auVar208);
                auVar121._16_16_ = auVar136;
                auVar121._0_16_ = auVar208;
                auVar53 = vcmpps_avx(auVar234,_DAT_00320640,2);
                auVar126 = vcvtdq2ps_avx(auVar121);
                auVar12._4_4_ =
                     (fVar188 + auVar126._4_4_ * 0.6931472 +
                     fVar188 * fVar188 *
                     (fVar188 * (fVar188 * (fVar188 * (fVar188 * (fVar188 * (fVar188 * (fVar188 * (
                                                  fVar188 * (fVar188 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar12._0_4_ =
                     (fVar186 + auVar126._0_4_ * 0.6931472 +
                     fVar186 * fVar186 *
                     (fVar186 * (fVar186 * (fVar186 * (fVar186 * (fVar186 * (fVar186 * (fVar186 * (
                                                  fVar186 * (fVar186 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar12._8_4_ =
                     (fVar293 + auVar126._8_4_ * 0.6931472 +
                     fVar293 * fVar293 *
                     (fVar293 * (fVar293 * (fVar293 * (fVar293 * (fVar293 * (fVar293 * (fVar293 * (
                                                  fVar293 * (fVar293 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar12._12_4_ =
                     (fVar294 + auVar126._12_4_ * 0.6931472 +
                     fVar294 * fVar294 *
                     (fVar294 * (fVar294 * (fVar294 * (fVar294 * (fVar294 * (fVar294 * (fVar294 * (
                                                  fVar294 * (fVar294 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar12._16_4_ =
                     (fVar295 + auVar126._16_4_ * 0.6931472 +
                     fVar295 * fVar295 *
                     (fVar295 * (fVar295 * (fVar295 * (fVar295 * (fVar295 * (fVar295 * (fVar295 * (
                                                  fVar295 * (fVar295 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar12._20_4_ =
                     (fVar296 + auVar126._20_4_ * 0.6931472 +
                     fVar296 * fVar296 *
                     (fVar296 * (fVar296 * (fVar296 * (fVar296 * (fVar296 * (fVar296 * (fVar296 * (
                                                  fVar296 * (fVar296 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar12._24_4_ =
                     (fVar297 + auVar126._24_4_ * 0.6931472 +
                     fVar297 * fVar297 *
                     (fVar297 * (fVar297 * (fVar297 * (fVar297 * (fVar297 * (fVar297 * (fVar297 * (
                                                  fVar297 * (fVar297 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar12._28_4_ = auVar171._28_4_ + -1.0 + auVar269._28_4_ + auVar126._28_4_ + 0.0;
                auVar166._8_4_ = 0x7fffffff;
                auVar166._0_8_ = 0x7fffffff7fffffff;
                auVar166._12_4_ = 0x7fffffff;
                auVar166._16_4_ = 0x7fffffff;
                auVar166._20_4_ = 0x7fffffff;
                auVar166._24_4_ = 0x7fffffff;
                auVar166._28_4_ = 0x7fffffff;
                auVar269 = vblendvps_avx(auVar12,auVar166,auVar53);
                auVar167._8_4_ = 0x42b0c0a5;
                auVar167._0_8_ = 0x42b0c0a542b0c0a5;
                auVar167._12_4_ = 0x42b0c0a5;
                auVar167._16_4_ = 0x42b0c0a5;
                auVar167._20_4_ = 0x42b0c0a5;
                auVar167._24_4_ = 0x42b0c0a5;
                auVar167._28_4_ = 0x42b0c0a5;
                auVar269 = vminps_avx(auVar269,auVar167);
                auVar168._8_4_ = 0xc2b0c0a5;
                auVar168._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar168._12_4_ = 0xc2b0c0a5;
                auVar168._16_4_ = 0xc2b0c0a5;
                auVar168._20_4_ = 0xc2b0c0a5;
                auVar168._24_4_ = 0xc2b0c0a5;
                auVar168._28_4_ = 0xc2b0c0a5;
                auVar53 = vmaxps_avx(auVar269,auVar168);
                auVar264 = ZEXT864(0) << 0x20;
                auVar169._0_4_ = auVar53._0_4_ * 1.442695 + 0.5;
                auVar169._4_4_ = auVar53._4_4_ * 1.442695 + 0.5;
                auVar169._8_4_ = auVar53._8_4_ * 1.442695 + 0.5;
                auVar169._12_4_ = auVar53._12_4_ * 1.442695 + 0.5;
                auVar169._16_4_ = auVar53._16_4_ * 1.442695 + 0.5;
                auVar169._20_4_ = auVar53._20_4_ * 1.442695 + 0.5;
                auVar169._24_4_ = auVar53._24_4_ * 1.442695 + 0.5;
                auVar169._28_4_ = 0xc2afc0a5;
                auVar126 = vroundps_avx(auVar169,1);
                auVar269 = vcmpps_avx(auVar169,auVar126,1);
                auVar269 = vandps_avx(auVar269,auVar79);
                auVar269 = vsubps_avx(auVar126,auVar269);
                auVar13._4_4_ = auVar269._4_4_ * 0.6931472;
                auVar13._0_4_ = auVar269._0_4_ * 0.6931472;
                auVar13._8_4_ = auVar269._8_4_ * 0.6931472;
                auVar13._12_4_ = auVar269._12_4_ * 0.6931472;
                auVar13._16_4_ = auVar269._16_4_ * 0.6931472;
                auVar13._20_4_ = auVar269._20_4_ * 0.6931472;
                auVar13._24_4_ = auVar269._24_4_ * 0.6931472;
                auVar13._28_4_ = auVar126._28_4_;
                auVar53 = vsubps_avx(auVar53,auVar13);
                fVar186 = auVar53._0_4_;
                fVar188 = auVar53._4_4_;
                fVar293 = auVar53._8_4_;
                fVar294 = auVar53._12_4_;
                fVar295 = auVar53._16_4_;
                fVar296 = auVar53._20_4_;
                fVar297 = auVar53._24_4_;
                auVar86 = ZEXT3264(auVar79);
                fVar207 = ((((fVar186 * 0.00019875691 + 0.0013981999) * fVar186 + 0.008333452) *
                            fVar186 + 0.041665796) * fVar186 + 0.16666666) * fVar186 + 0.5;
                fVar248 = ((((fVar188 * 0.00019875691 + 0.0013981999) * fVar188 + 0.008333452) *
                            fVar188 + 0.041665796) * fVar188 + 0.16666666) * fVar188 + 0.5;
                fVar249 = ((((fVar293 * 0.00019875691 + 0.0013981999) * fVar293 + 0.008333452) *
                            fVar293 + 0.041665796) * fVar293 + 0.16666666) * fVar293 + 0.5;
                fVar250 = ((((fVar294 * 0.00019875691 + 0.0013981999) * fVar294 + 0.008333452) *
                            fVar294 + 0.041665796) * fVar294 + 0.16666666) * fVar294 + 0.5;
                fVar251 = ((((fVar295 * 0.00019875691 + 0.0013981999) * fVar295 + 0.008333452) *
                            fVar295 + 0.041665796) * fVar295 + 0.16666666) * fVar295 + 0.5;
                fVar252 = ((((fVar296 * 0.00019875691 + 0.0013981999) * fVar296 + 0.008333452) *
                            fVar296 + 0.041665796) * fVar296 + 0.16666666) * fVar296 + 0.5;
                fVar253 = ((((fVar297 * 0.00019875691 + 0.0013981999) * fVar297 + 0.008333452) *
                            fVar297 + 0.041665796) * fVar297 + 0.16666666) * fVar297 + 0.5;
                in_ZMM7 = ZEXT3264(CONCAT428(auVar234._28_4_ + 0.0013981999 + 0.008333452 +
                                             0.041665796 + 0.16666666 + 0.5,
                                             CONCAT424(fVar253,CONCAT420(fVar252,CONCAT416(fVar251,
                                                  CONCAT412(fVar250,CONCAT48(fVar249,CONCAT44(
                                                  fVar248,fVar207))))))));
                auVar208._0_4_ = (int)auVar269._0_4_;
                auVar208._4_4_ = (int)auVar269._4_4_;
                auVar208._8_4_ = (int)auVar269._8_4_;
                auVar208._12_4_ = (int)auVar269._12_4_;
                auVar170._16_4_ = (int)auVar269._16_4_;
                auVar170._0_16_ = auVar208;
                auVar170._20_4_ = (int)auVar269._20_4_;
                auVar170._24_4_ = (int)auVar269._24_4_;
                auVar170._28_4_ = (int)auVar269._28_4_;
                auVar208 = vpslld_avx(auVar208,0x17);
                auVar136 = vpslld_avx(auVar170._16_16_,0x17);
                auVar136 = vpaddd_avx(auVar136,auVar199);
                auVar208 = vpaddd_avx(auVar208,auVar199);
                auVar122._0_4_ =
                     (fVar186 + fVar46 + fVar186 * fVar186 * fVar207) * auVar208._0_4_ + fVar46;
                auVar122._4_4_ =
                     (fVar188 + fVar60 + fVar188 * fVar188 * fVar248) * auVar208._4_4_ + fVar60;
                auVar122._8_4_ =
                     (fVar293 + fVar87 + fVar293 * fVar293 * fVar249) * auVar208._8_4_ + fVar87;
                auVar122._12_4_ =
                     (fVar294 + fVar88 + fVar294 * fVar294 * fVar250) * auVar208._12_4_ + fVar88;
                auVar122._16_4_ =
                     (fVar295 + fVar190 + fVar295 * fVar295 * fVar251) * auVar136._0_4_ + fVar190;
                auVar122._20_4_ =
                     (fVar296 + fVar89 + fVar296 * fVar296 * fVar252) * auVar136._4_4_ + fVar89;
                auVar122._24_4_ =
                     (fVar297 + fVar187 + fVar297 * fVar297 * fVar253) * auVar136._8_4_ + fVar187;
                auVar122._28_4_ = auVar53._28_4_ + fVar189 + auVar126._28_4_ + fVar189;
                auVar269 = vrcpps_avx(auVar122);
                fVar46 = auVar269._0_4_;
                fVar60 = auVar269._4_4_;
                fVar87 = auVar269._8_4_;
                fVar88 = auVar269._12_4_;
                fVar190 = auVar269._16_4_;
                fVar89 = auVar269._20_4_;
                fVar187 = auVar269._24_4_;
                auVar79._4_4_ = auVar122._4_4_ * (fVar60 + fVar60);
                auVar79._0_4_ = auVar122._0_4_ * (fVar46 + fVar46);
                auVar79._8_4_ = auVar122._8_4_ * (fVar87 + fVar87);
                auVar79._12_4_ = auVar122._12_4_ * (fVar88 + fVar88);
                auVar79._16_4_ = auVar122._16_4_ * (fVar190 + fVar190);
                auVar79._20_4_ = auVar122._20_4_ * (fVar89 + fVar89);
                auVar79._24_4_ = auVar122._24_4_ * (fVar187 + fVar187);
                auVar79._28_4_ = auVar122._28_4_;
                auVar53._8_4_ = 0x40000000;
                auVar53._0_8_ = 0x4000000040000000;
                auVar53._12_4_ = 0x40000000;
                auVar53._16_4_ = 0x40000000;
                auVar53._20_4_ = 0x40000000;
                auVar53._24_4_ = 0x40000000;
                auVar53._28_4_ = 0x40000000;
                auVar79 = vsubps_avx(auVar53,auVar79);
                auVar171._0_4_ = fVar46 + fVar46 + -1.0;
                auVar171._4_4_ = fVar60 + fVar60 + -1.0;
                auVar171._8_4_ = fVar87 + fVar87 + -1.0;
                auVar171._12_4_ = fVar88 + fVar88 + -1.0;
                auVar171._16_4_ = fVar190 + fVar190 + -1.0;
                auVar171._20_4_ = fVar89 + fVar89 + -1.0;
                auVar171._24_4_ = fVar187 + fVar187 + -1.0;
                auVar171._28_4_ = auVar269._28_4_ + auVar269._28_4_ + -1.0;
                auVar117._0_4_ = auVar171._0_4_ + fVar46 * auVar79._0_4_;
                auVar117._4_4_ = auVar171._4_4_ + fVar60 * auVar79._4_4_;
                auVar117._8_4_ = auVar171._8_4_ + fVar87 * auVar79._8_4_;
                auVar117._12_4_ = auVar171._12_4_ + fVar88 * auVar79._12_4_;
                auVar117._16_4_ = auVar171._16_4_ + fVar190 * auVar79._16_4_;
                auVar117._20_4_ = auVar171._20_4_ + fVar89 * auVar79._20_4_;
                auVar117._24_4_ = auVar171._24_4_ + fVar187 * auVar79._24_4_;
                goto LAB_00312f24;
              case 6:
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar60 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar171._4_4_ = fVar60;
                auVar171._0_4_ = fVar60;
                auVar171._8_4_ = fVar60;
                auVar171._12_4_ = fVar60;
                auVar171._16_4_ = fVar60;
                auVar171._20_4_ = fVar60;
                auVar171._24_4_ = fVar60;
                auVar171._28_4_ = fVar60;
                auVar126._0_4_ = auVar274._0_4_ * fVar46 + fVar60;
                auVar126._4_4_ = auVar274._4_4_ * fVar46 + fVar60;
                auVar126._8_4_ = fVar135 * fVar46 + fVar60;
                auVar126._12_4_ = fVar182 * fVar46 + fVar60;
                auVar126._16_4_ = fVar183 * fVar46 + fVar60;
                auVar126._20_4_ = fVar184 * fVar46 + fVar60;
                auVar126._24_4_ = fVar185 * fVar46 + fVar60;
                auVar126._28_4_ = fVar46 + fVar60;
                auVar269 = vmaxps_avx(auVar53,auVar126);
                auVar269 = vminps_avx(auVar269,auVar79);
                auVar117 = auVar269._0_28_;
LAB_00312f24:
                in_ZMM3 = ZEXT3264(auVar171);
                auVar275._0_4_ = auVar274._0_4_ * auVar117._0_4_;
                auVar275._4_4_ = auVar274._4_4_ * auVar117._4_4_;
                auVar275._8_4_ = fVar135 * auVar117._8_4_;
                auVar275._12_4_ = fVar182 * auVar117._12_4_;
                auVar275._16_4_ = fVar183 * auVar117._16_4_;
                auVar275._20_4_ = fVar184 * auVar117._20_4_;
                auVar275._24_4_ = fVar185 * auVar117._24_4_;
                auVar269 = auVar275._0_32_;
              }
              *pauVar38 = auVar269;
              pauVar38 = pauVar38 + 1;
              iVar40 = iVar40 + 8;
              bVar45 = iVar42 != iVar3;
              iVar42 = iVar42 + 1;
            } while (bVar45);
          }
          local_110 = local_110 + 1;
        } while (local_110 != _h);
      }
      if ((uVar2 == 1 && local_e0 == 0) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        uVar39 = 0;
        auVar86 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar274 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar264 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar259._8_4_ = 0x42b0c0a5;
        auVar259._0_8_ = 0x42b0c0a542b0c0a5;
        auVar259._12_4_ = 0x42b0c0a5;
        auVar259._16_4_ = 0x42b0c0a5;
        auVar259._20_4_ = 0x42b0c0a5;
        auVar259._24_4_ = 0x42b0c0a5;
        auVar259._28_4_ = 0x42b0c0a5;
        auVar262._8_4_ = 0xc2b0c0a5;
        auVar262._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar262._12_4_ = 0xc2b0c0a5;
        auVar262._16_4_ = 0xc2b0c0a5;
        auVar262._20_4_ = 0xc2b0c0a5;
        auVar262._24_4_ = 0xc2b0c0a5;
        auVar262._28_4_ = 0xc2b0c0a5;
        do {
          if (-1 < iVar3) {
            pauVar38 = (undefined1 (*) [32])
                       ((long)top_blob->w * uVar39 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar42 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar275 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar275 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) + uVar39 * 0x20))
                ;
              }
              if (0 < iVar27) {
                pfVar35 = (float *)((this->weight_data_packed).cstep * uVar39 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                pfVar43 = (float *)((long)(_func_int ***)local_b8.data +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar42) * 4);
                uVar34 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar31 = pfVar43;
                    iVar40 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      fVar46 = *pfVar31;
                      auVar275 = ZEXT3264(CONCAT428(auVar275._28_4_ + fVar46,
                                                    CONCAT424(auVar275._24_4_ + fVar46 * pfVar35[6],
                                                              CONCAT420(auVar275._20_4_ +
                                                                        fVar46 * pfVar35[5],
                                                                        CONCAT416(auVar275._16_4_ +
                                                                                  fVar46 * pfVar35[4
                                                  ],CONCAT412(auVar275._12_4_ + fVar46 * pfVar35[3],
                                                              CONCAT48(auVar275._8_4_ +
                                                                       fVar46 * pfVar35[2],
                                                                       CONCAT44(auVar275._4_4_ +
                                                                                fVar46 * pfVar35[1],
                                                                                auVar275._0_4_ +
                                                                                fVar46 * *pfVar35)))
                                                  )))));
                      pfVar35 = pfVar35 + 8;
                      pfVar31 = pfVar31 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  uVar34 = uVar34 + 1;
                  pfVar43 = (float *)((long)pfVar43 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar34 != uVar41);
              }
              auVar271 = auVar275._0_32_;
              p_Var4 = pp_Var5[-3];
              fVar294 = auVar275._8_4_;
              fVar295 = auVar275._12_4_;
              fVar296 = auVar275._16_4_;
              fVar297 = auVar275._20_4_;
              fVar207 = auVar275._24_4_;
              fVar135 = auVar274._0_4_;
              fVar182 = auVar274._4_4_;
              fVar183 = auVar274._8_4_;
              fVar184 = auVar274._12_4_;
              fVar185 = auVar274._16_4_;
              fVar186 = auVar274._20_4_;
              fVar188 = auVar274._24_4_;
              fVar293 = auVar274._28_4_;
              auVar206 = auVar264._0_32_;
              fVar46 = auVar264._0_4_;
              fVar60 = auVar264._4_4_;
              fVar87 = auVar264._8_4_;
              fVar88 = auVar264._12_4_;
              fVar190 = auVar264._16_4_;
              fVar89 = auVar264._20_4_;
              fVar187 = auVar264._24_4_;
              fVar189 = auVar264._28_4_;
              auVar276._28_36_ = auVar275._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar271 = vmaxps_avx(auVar271,auVar86._0_32_);
                break;
              case 2:
                auVar206 = vmaxps_avx(auVar271,ZEXT1632(ZEXT816(0) << 0x40));
                in_ZMM7 = ZEXT3264(auVar206);
                auVar86 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar269 = vminps_avx(auVar271,ZEXT1632(ZEXT816(0) << 0x40));
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar271._0_4_ = fVar46 * auVar269._0_4_ + auVar206._0_4_;
                auVar271._4_4_ = fVar46 * auVar269._4_4_ + auVar206._4_4_;
                auVar271._8_4_ = fVar46 * auVar269._8_4_ + auVar206._8_4_;
                auVar271._12_4_ = fVar46 * auVar269._12_4_ + auVar206._12_4_;
                auVar271._16_4_ = fVar46 * auVar269._16_4_ + auVar206._16_4_;
                auVar271._20_4_ = fVar46 * auVar269._20_4_ + auVar206._20_4_;
                auVar271._24_4_ = fVar46 * auVar269._24_4_ + auVar206._24_4_;
                auVar271._28_4_ = auVar269._28_4_ + auVar206._28_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar240._4_4_ = uVar1;
                auVar240._0_4_ = uVar1;
                auVar240._8_4_ = uVar1;
                auVar240._12_4_ = uVar1;
                auVar240._16_4_ = uVar1;
                auVar240._20_4_ = uVar1;
                auVar240._24_4_ = uVar1;
                auVar240._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar291._4_4_ = uVar1;
                auVar291._0_4_ = uVar1;
                auVar291._8_4_ = uVar1;
                auVar291._12_4_ = uVar1;
                auVar291._16_4_ = uVar1;
                auVar291._20_4_ = uVar1;
                auVar291._24_4_ = uVar1;
                auVar291._28_4_ = uVar1;
                auVar206 = vmaxps_avx(auVar271,auVar240);
                in_ZMM7 = ZEXT3264(auVar206);
                auVar271 = vminps_avx(auVar291,auVar206);
                break;
              case 4:
                auVar241._0_8_ = auVar275._0_8_ ^ 0x8000000080000000;
                auVar241._8_4_ = -fVar294;
                auVar241._12_4_ = -fVar295;
                auVar241._16_4_ = -fVar296;
                auVar241._20_4_ = -fVar297;
                auVar241._24_4_ = -fVar207;
                auVar241._28_4_ = -auVar275._28_4_;
                auVar81._8_4_ = 0x42b0c0a5;
                auVar81._0_8_ = 0x42b0c0a542b0c0a5;
                auVar81._12_4_ = 0x42b0c0a5;
                auVar81._16_4_ = 0x42b0c0a5;
                auVar81._20_4_ = 0x42b0c0a5;
                auVar81._24_4_ = 0x42b0c0a5;
                auVar81._28_4_ = 0x42b0c0a5;
                auVar269 = vminps_avx(auVar241,auVar81);
                auVar82._8_4_ = 0xc2b0c0a5;
                auVar82._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar82._12_4_ = 0xc2b0c0a5;
                auVar82._16_4_ = 0xc2b0c0a5;
                auVar82._20_4_ = 0xc2b0c0a5;
                auVar82._24_4_ = 0xc2b0c0a5;
                auVar82._28_4_ = 0xc2b0c0a5;
                auVar79 = vmaxps_avx(auVar269,auVar82);
                auVar270._0_4_ = auVar79._0_4_ * 1.442695 + fVar135;
                auVar270._4_4_ = auVar79._4_4_ * 1.442695 + fVar182;
                auVar270._8_4_ = auVar79._8_4_ * 1.442695 + fVar183;
                auVar270._12_4_ = auVar79._12_4_ * 1.442695 + fVar184;
                auVar270._16_4_ = auVar79._16_4_ * 1.442695 + fVar185;
                auVar270._20_4_ = auVar79._20_4_ * 1.442695 + fVar186;
                auVar270._24_4_ = auVar79._24_4_ * 1.442695 + fVar188;
                auVar270._28_4_ = auVar275._28_4_ + fVar293;
                auVar53 = vroundps_avx(auVar270,1);
                auVar269 = vcmpps_avx(auVar270,auVar53,1);
                auVar269 = vandps_avx(auVar269,auVar206);
                auVar269 = vsubps_avx(auVar53,auVar269);
                fVar294 = auVar269._0_4_ * -0.6931472 + auVar79._0_4_;
                fVar295 = auVar269._4_4_ * -0.6931472 + auVar79._4_4_;
                fVar296 = auVar269._8_4_ * -0.6931472 + auVar79._8_4_;
                fVar297 = auVar269._12_4_ * -0.6931472 + auVar79._12_4_;
                fVar207 = auVar269._16_4_ * -0.6931472 + auVar79._16_4_;
                fVar248 = auVar269._20_4_ * -0.6931472 + auVar79._20_4_;
                fVar249 = auVar269._24_4_ * -0.6931472 + auVar79._24_4_;
                auVar210._0_4_ = (int)auVar269._0_4_;
                auVar210._4_4_ = (int)auVar269._4_4_;
                auVar210._8_4_ = (int)auVar269._8_4_;
                auVar210._12_4_ = (int)auVar269._12_4_;
                auVar242._16_4_ = (int)auVar269._16_4_;
                auVar242._0_16_ = auVar210;
                auVar242._20_4_ = (int)auVar269._20_4_;
                auVar242._24_4_ = (int)auVar269._24_4_;
                auVar242._28_4_ = (int)auVar269._28_4_;
                auVar208 = vpslld_avx(auVar210,0x17);
                auVar136 = vpslld_avx(auVar242._16_16_,0x17);
                auVar62._8_4_ = 0x3f800000;
                auVar62._0_8_ = 0x3f8000003f800000;
                auVar62._12_4_ = 0x3f800000;
                auVar136 = vpaddd_avx(auVar136,auVar62);
                auVar208 = vpaddd_avx(auVar208,auVar62);
                auVar129._0_4_ =
                     (fVar294 + fVar46 +
                     fVar294 * fVar294 *
                     (fVar135 +
                     ((((fVar294 * 0.00019875691 + 0.0013981999) * fVar294 + 0.008333452) * fVar294
                      + 0.041665796) * fVar294 + 0.16666666) * fVar294)) * auVar208._0_4_ + fVar46;
                auVar129._4_4_ =
                     (fVar295 + fVar60 +
                     fVar295 * fVar295 *
                     (fVar182 +
                     ((((fVar295 * 0.00019875691 + 0.0013981999) * fVar295 + 0.008333452) * fVar295
                      + 0.041665796) * fVar295 + 0.16666666) * fVar295)) * auVar208._4_4_ + fVar60;
                auVar129._8_4_ =
                     (fVar296 + fVar87 +
                     fVar296 * fVar296 *
                     (fVar183 +
                     ((((fVar296 * 0.00019875691 + 0.0013981999) * fVar296 + 0.008333452) * fVar296
                      + 0.041665796) * fVar296 + 0.16666666) * fVar296)) * auVar208._8_4_ + fVar87;
                auVar129._12_4_ =
                     (fVar297 + fVar88 +
                     fVar297 * fVar297 *
                     (fVar184 +
                     ((((fVar297 * 0.00019875691 + 0.0013981999) * fVar297 + 0.008333452) * fVar297
                      + 0.041665796) * fVar297 + 0.16666666) * fVar297)) * auVar208._12_4_ + fVar88;
                auVar129._16_4_ =
                     (fVar207 + fVar190 +
                     fVar207 * fVar207 *
                     (fVar185 +
                     ((((fVar207 * 0.00019875691 + 0.0013981999) * fVar207 + 0.008333452) * fVar207
                      + 0.041665796) * fVar207 + 0.16666666) * fVar207)) * auVar136._0_4_ + fVar190;
                auVar129._20_4_ =
                     (fVar248 + fVar89 +
                     fVar248 * fVar248 *
                     (fVar186 +
                     ((((fVar248 * 0.00019875691 + 0.0013981999) * fVar248 + 0.008333452) * fVar248
                      + 0.041665796) * fVar248 + 0.16666666) * fVar248)) * auVar136._4_4_ + fVar89;
                auVar129._24_4_ =
                     (fVar249 + fVar187 +
                     fVar249 * fVar249 *
                     (fVar188 +
                     ((((fVar249 * 0.00019875691 + 0.0013981999) * fVar249 + 0.008333452) * fVar249
                      + 0.041665796) * fVar249 + 0.16666666) * fVar249)) * auVar136._8_4_ + fVar187;
                auVar129._28_4_ =
                     auVar53._28_4_ + auVar79._28_4_ + fVar189 + fVar293 + -0.47508308 + fVar189;
                auVar269 = vrcpps_avx(auVar129);
                in_ZMM7 = ZEXT3264(auVar269);
                fVar46 = auVar269._0_4_;
                fVar60 = auVar269._4_4_;
                auVar19._4_4_ = auVar129._4_4_ * fVar60;
                auVar19._0_4_ = auVar129._0_4_ * fVar46;
                fVar87 = auVar269._8_4_;
                auVar19._8_4_ = auVar129._8_4_ * fVar87;
                fVar88 = auVar269._12_4_;
                auVar19._12_4_ = auVar129._12_4_ * fVar88;
                fVar190 = auVar269._16_4_;
                auVar19._16_4_ = auVar129._16_4_ * fVar190;
                fVar89 = auVar269._20_4_;
                auVar19._20_4_ = auVar129._20_4_ * fVar89;
                fVar187 = auVar269._24_4_;
                auVar19._24_4_ = auVar129._24_4_ * fVar187;
                auVar19._28_4_ = auVar129._28_4_;
                auVar206 = vsubps_avx(auVar206,auVar19);
                auVar271._0_4_ = fVar46 + fVar46 * auVar206._0_4_;
                auVar271._4_4_ = fVar60 + fVar60 * auVar206._4_4_;
                auVar271._8_4_ = fVar87 + fVar87 * auVar206._8_4_;
                auVar271._12_4_ = fVar88 + fVar88 * auVar206._12_4_;
                auVar271._16_4_ = fVar190 + fVar190 * auVar206._16_4_;
                auVar271._20_4_ = fVar89 + fVar89 * auVar206._20_4_;
                auVar271._24_4_ = fVar187 + fVar187 * auVar206._24_4_;
                auVar271._28_4_ = auVar269._28_4_ + auVar206._28_4_;
                break;
              case 5:
                auVar269 = vminps_avx(auVar271,auVar259);
                auVar79 = vmaxps_avx(auVar262,auVar269);
                auVar238._0_4_ = fVar135 + auVar79._0_4_ * 1.442695;
                auVar238._4_4_ = fVar182 + auVar79._4_4_ * 1.442695;
                auVar238._8_4_ = fVar183 + auVar79._8_4_ * 1.442695;
                auVar238._12_4_ = fVar184 + auVar79._12_4_ * 1.442695;
                auVar238._16_4_ = fVar185 + auVar79._16_4_ * 1.442695;
                auVar238._20_4_ = fVar186 + auVar79._20_4_ * 1.442695;
                auVar238._24_4_ = fVar188 + auVar79._24_4_ * 1.442695;
                auVar238._28_4_ = fVar293 + in_ZMM7._28_4_;
                auVar53 = vroundps_avx(auVar238,1);
                auVar269 = vcmpps_avx(auVar238,auVar53,1);
                auVar269 = vandps_avx(auVar269,auVar206);
                auVar269 = vsubps_avx(auVar53,auVar269);
                auVar15._4_4_ = auVar269._4_4_ * 0.6931472;
                auVar15._0_4_ = auVar269._0_4_ * 0.6931472;
                auVar15._8_4_ = auVar269._8_4_ * 0.6931472;
                auVar15._12_4_ = auVar269._12_4_ * 0.6931472;
                auVar15._16_4_ = auVar269._16_4_ * 0.6931472;
                auVar15._20_4_ = auVar269._20_4_ * 0.6931472;
                auVar15._24_4_ = auVar269._24_4_ * 0.6931472;
                auVar15._28_4_ = auVar53._28_4_;
                auVar79 = vsubps_avx(auVar79,auVar15);
                fVar248 = auVar79._0_4_;
                fVar249 = auVar79._4_4_;
                fVar250 = auVar79._8_4_;
                fVar251 = auVar79._12_4_;
                fVar252 = auVar79._16_4_;
                fVar253 = auVar79._20_4_;
                fVar298 = auVar79._24_4_;
                auVar137._0_4_ = (int)auVar269._0_4_;
                auVar137._4_4_ = (int)auVar269._4_4_;
                auVar137._8_4_ = (int)auVar269._8_4_;
                auVar137._12_4_ = (int)auVar269._12_4_;
                auVar172._16_4_ = (int)auVar269._16_4_;
                auVar172._0_16_ = auVar137;
                auVar172._20_4_ = (int)auVar269._20_4_;
                auVar172._24_4_ = (int)auVar269._24_4_;
                auVar172._28_4_ = (int)auVar269._28_4_;
                auVar208 = vpslld_avx(auVar137,0x17);
                auVar136 = vpslld_avx(auVar172._16_16_,0x17);
                auVar200._8_4_ = 0x3f800000;
                auVar200._0_8_ = 0x3f8000003f800000;
                auVar200._12_4_ = 0x3f800000;
                auVar136 = vpaddd_avx(auVar136,auVar200);
                auVar208 = vpaddd_avx(auVar208,auVar200);
                auVar239._0_4_ =
                     (fVar248 + fVar46 +
                     fVar248 * fVar248 *
                     (((((fVar248 * 0.00019875691 + 0.0013981999) * fVar248 + 0.008333452) * fVar248
                       + 0.041665796) * fVar248 + 0.16666666) * fVar248 + fVar135)) * auVar208._0_4_
                     + fVar46;
                auVar239._4_4_ =
                     (fVar249 + fVar60 +
                     fVar249 * fVar249 *
                     (((((fVar249 * 0.00019875691 + 0.0013981999) * fVar249 + 0.008333452) * fVar249
                       + 0.041665796) * fVar249 + 0.16666666) * fVar249 + fVar182)) * auVar208._4_4_
                     + fVar60;
                auVar239._8_4_ =
                     (fVar250 + fVar87 +
                     fVar250 * fVar250 *
                     (((((fVar250 * 0.00019875691 + 0.0013981999) * fVar250 + 0.008333452) * fVar250
                       + 0.041665796) * fVar250 + 0.16666666) * fVar250 + fVar183)) * auVar208._8_4_
                     + fVar87;
                auVar239._12_4_ =
                     (fVar251 + fVar88 +
                     fVar251 * fVar251 *
                     (((((fVar251 * 0.00019875691 + 0.0013981999) * fVar251 + 0.008333452) * fVar251
                       + 0.041665796) * fVar251 + 0.16666666) * fVar251 + fVar184)) *
                     auVar208._12_4_ + fVar88;
                auVar239._16_4_ =
                     (fVar252 + fVar190 +
                     fVar252 * fVar252 *
                     (((((fVar252 * 0.00019875691 + 0.0013981999) * fVar252 + 0.008333452) * fVar252
                       + 0.041665796) * fVar252 + 0.16666666) * fVar252 + fVar185)) * auVar136._0_4_
                     + fVar190;
                auVar239._20_4_ =
                     (fVar253 + fVar89 +
                     fVar253 * fVar253 *
                     (((((fVar253 * 0.00019875691 + 0.0013981999) * fVar253 + 0.008333452) * fVar253
                       + 0.041665796) * fVar253 + 0.16666666) * fVar253 + fVar186)) * auVar136._4_4_
                     + fVar89;
                auVar239._24_4_ =
                     (fVar298 + fVar187 +
                     fVar298 * fVar298 *
                     (((((fVar298 * 0.00019875691 + 0.0013981999) * fVar298 + 0.008333452) * fVar298
                       + 0.041665796) * fVar298 + 0.16666666) * fVar298 + fVar188)) * auVar136._8_4_
                     + fVar187;
                auVar239._28_4_ =
                     auVar79._28_4_ + fVar189 +
                     in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                     fVar293 + fVar189;
                auVar54._8_4_ = 0x800000;
                auVar54._0_8_ = 0x80000000800000;
                auVar54._12_4_ = 0x800000;
                auVar54._16_4_ = 0x800000;
                auVar54._20_4_ = 0x800000;
                auVar54._24_4_ = 0x800000;
                auVar54._28_4_ = 0x800000;
                auVar53 = vmaxps_avx(auVar239,auVar54);
                auVar136 = vpsrld_avx(auVar53._16_16_,0x17);
                auVar55._8_4_ = 0x807fffff;
                auVar55._0_8_ = 0x807fffff807fffff;
                auVar55._12_4_ = 0x807fffff;
                auVar55._16_4_ = 0x807fffff;
                auVar55._20_4_ = 0x807fffff;
                auVar55._24_4_ = 0x807fffff;
                auVar55._28_4_ = 0x807fffff;
                auVar269 = vandps_avx(auVar53,auVar55);
                auVar126 = vorps_avx(auVar269,auVar274._0_32_);
                auVar56._8_4_ = 0x3f3504f3;
                auVar56._0_8_ = 0x3f3504f33f3504f3;
                auVar56._12_4_ = 0x3f3504f3;
                auVar56._16_4_ = 0x3f3504f3;
                auVar56._20_4_ = 0x3f3504f3;
                auVar56._24_4_ = 0x3f3504f3;
                auVar56._28_4_ = 0x3f3504f3;
                auVar79 = vcmpps_avx(auVar56,auVar126,2);
                auVar269 = vandnps_avx(auVar79,auVar126);
                fVar248 = auVar126._0_4_ + -1.0 + auVar269._0_4_;
                fVar249 = auVar126._4_4_ + -1.0 + auVar269._4_4_;
                fVar250 = auVar126._8_4_ + -1.0 + auVar269._8_4_;
                fVar251 = auVar126._12_4_ + -1.0 + auVar269._12_4_;
                fVar252 = auVar126._16_4_ + -1.0 + auVar269._16_4_;
                fVar253 = auVar126._20_4_ + -1.0 + auVar269._20_4_;
                fVar298 = auVar126._24_4_ + -1.0 + auVar269._24_4_;
                auVar136 = vpsubd_avx(auVar136,auVar79._16_16_);
                auVar208 = vpsrld_avx(auVar53._0_16_,0x17);
                auVar48._8_4_ = 0xffffff81;
                auVar48._0_8_ = 0xffffff81ffffff81;
                auVar48._12_4_ = 0xffffff81;
                auVar136 = vpaddd_avx(auVar136,auVar48);
                auVar208 = vpsubd_avx(auVar208,auVar79._0_16_);
                auVar208 = vpaddd_avx(auVar208,auVar48);
                auVar127._16_16_ = auVar136;
                auVar127._0_16_ = auVar208;
                auVar86 = ZEXT864(0) << 0x20;
                auVar79 = vcmpps_avx(auVar239,ZEXT832(0) << 0x20,2);
                auVar53 = vcvtdq2ps_avx(auVar127);
                auVar16._4_4_ =
                     (fVar249 + auVar53._4_4_ * 0.6931472 +
                     fVar249 * fVar249 *
                     (fVar249 * (fVar249 * (fVar249 * (fVar249 * (fVar249 * (fVar249 * (fVar249 * (
                                                  fVar249 * (fVar249 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar16._0_4_ =
                     (fVar248 + auVar53._0_4_ * 0.6931472 +
                     fVar248 * fVar248 *
                     (fVar248 * (fVar248 * (fVar248 * (fVar248 * (fVar248 * (fVar248 * (fVar248 * (
                                                  fVar248 * (fVar248 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar16._8_4_ =
                     (fVar250 + auVar53._8_4_ * 0.6931472 +
                     fVar250 * fVar250 *
                     (fVar250 * (fVar250 * (fVar250 * (fVar250 * (fVar250 * (fVar250 * (fVar250 * (
                                                  fVar250 * (fVar250 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar16._12_4_ =
                     (fVar251 + auVar53._12_4_ * 0.6931472 +
                     fVar251 * fVar251 *
                     (fVar251 * (fVar251 * (fVar251 * (fVar251 * (fVar251 * (fVar251 * (fVar251 * (
                                                  fVar251 * (fVar251 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar16._16_4_ =
                     (fVar252 + auVar53._16_4_ * 0.6931472 +
                     fVar252 * fVar252 *
                     (fVar252 * (fVar252 * (fVar252 * (fVar252 * (fVar252 * (fVar252 * (fVar252 * (
                                                  fVar252 * (fVar252 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar16._20_4_ =
                     (fVar253 + auVar53._20_4_ * 0.6931472 +
                     fVar253 * fVar253 *
                     (fVar253 * (fVar253 * (fVar253 * (fVar253 * (fVar253 * (fVar253 * (fVar253 * (
                                                  fVar253 * (fVar253 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar16._24_4_ =
                     (fVar298 + auVar53._24_4_ * 0.6931472 +
                     fVar298 * fVar298 *
                     (fVar298 * (fVar298 * (fVar298 * (fVar298 * (fVar298 * (fVar298 * (fVar298 * (
                                                  fVar298 * (fVar298 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar16._28_4_ = auVar126._28_4_ + -1.0 + auVar269._28_4_ + auVar53._28_4_ + 0.0;
                auVar173._8_4_ = 0x7fffffff;
                auVar173._0_8_ = 0x7fffffff7fffffff;
                auVar173._12_4_ = 0x7fffffff;
                auVar173._16_4_ = 0x7fffffff;
                auVar173._20_4_ = 0x7fffffff;
                auVar173._24_4_ = 0x7fffffff;
                auVar173._28_4_ = 0x7fffffff;
                auVar269 = vblendvps_avx(auVar16,auVar173,auVar79);
                auVar269 = vminps_avx(auVar259,auVar269);
                auVar79 = vmaxps_avx(auVar262,auVar269);
                auVar174._0_4_ = auVar79._0_4_ * 1.442695 + fVar135;
                auVar174._4_4_ = auVar79._4_4_ * 1.442695 + fVar182;
                auVar174._8_4_ = auVar79._8_4_ * 1.442695 + fVar183;
                auVar174._12_4_ = auVar79._12_4_ * 1.442695 + fVar184;
                auVar174._16_4_ = auVar79._16_4_ * 1.442695 + fVar185;
                auVar174._20_4_ = auVar79._20_4_ * 1.442695 + fVar186;
                auVar174._24_4_ = auVar79._24_4_ * 1.442695 + fVar188;
                auVar174._28_4_ = fVar293 + NAN;
                auVar53 = vroundps_avx(auVar174,1);
                auVar269 = vcmpps_avx(auVar174,auVar53,1);
                auVar269 = vandps_avx(auVar269,auVar206);
                auVar269 = vsubps_avx(auVar53,auVar269);
                auVar17._4_4_ = auVar269._4_4_ * 0.6931472;
                auVar17._0_4_ = auVar269._0_4_ * 0.6931472;
                auVar17._8_4_ = auVar269._8_4_ * 0.6931472;
                auVar17._12_4_ = auVar269._12_4_ * 0.6931472;
                auVar17._16_4_ = auVar269._16_4_ * 0.6931472;
                auVar17._20_4_ = auVar269._20_4_ * 0.6931472;
                auVar17._24_4_ = auVar269._24_4_ * 0.6931472;
                auVar17._28_4_ = auVar53._28_4_;
                auVar79 = vsubps_avx(auVar79,auVar17);
                fVar248 = auVar79._0_4_;
                fVar249 = auVar79._4_4_;
                fVar250 = auVar79._8_4_;
                fVar251 = auVar79._12_4_;
                fVar252 = auVar79._16_4_;
                fVar253 = auVar79._20_4_;
                fVar298 = auVar79._24_4_;
                auVar264 = ZEXT3264(auVar206);
                auVar274 = ZEXT3264(auVar274._0_32_);
                fVar135 = fVar135 + ((((fVar248 * 0.00019875691 + 0.0013981999) * fVar248 +
                                      0.008333452) * fVar248 + 0.041665796) * fVar248 + 0.16666666)
                                    * fVar248;
                fVar182 = fVar182 + ((((fVar249 * 0.00019875691 + 0.0013981999) * fVar249 +
                                      0.008333452) * fVar249 + 0.041665796) * fVar249 + 0.16666666)
                                    * fVar249;
                fVar183 = fVar183 + ((((fVar250 * 0.00019875691 + 0.0013981999) * fVar250 +
                                      0.008333452) * fVar250 + 0.041665796) * fVar250 + 0.16666666)
                                    * fVar250;
                fVar184 = fVar184 + ((((fVar251 * 0.00019875691 + 0.0013981999) * fVar251 +
                                      0.008333452) * fVar251 + 0.041665796) * fVar251 + 0.16666666)
                                    * fVar251;
                fVar185 = fVar185 + ((((fVar252 * 0.00019875691 + 0.0013981999) * fVar252 +
                                      0.008333452) * fVar252 + 0.041665796) * fVar252 + 0.16666666)
                                    * fVar252;
                fVar186 = fVar186 + ((((fVar253 * 0.00019875691 + 0.0013981999) * fVar253 +
                                      0.008333452) * fVar253 + 0.041665796) * fVar253 + 0.16666666)
                                    * fVar253;
                fVar188 = fVar188 + ((((fVar298 * 0.00019875691 + 0.0013981999) * fVar298 +
                                      0.008333452) * fVar298 + 0.041665796) * fVar298 + 0.16666666)
                                    * fVar298;
                in_ZMM7 = ZEXT3264(CONCAT428(fVar293 + auVar239._28_4_ + 0.0013981999 + 0.008333452
                                                       + 0.041665796 + 0.16666666,
                                             CONCAT424(fVar188,CONCAT420(fVar186,CONCAT416(fVar185,
                                                  CONCAT412(fVar184,CONCAT48(fVar183,CONCAT44(
                                                  fVar182,fVar135))))))));
                auVar138._0_4_ = (int)auVar269._0_4_;
                auVar138._4_4_ = (int)auVar269._4_4_;
                auVar138._8_4_ = (int)auVar269._8_4_;
                auVar138._12_4_ = (int)auVar269._12_4_;
                auVar175._16_4_ = (int)auVar269._16_4_;
                auVar175._0_16_ = auVar138;
                auVar175._20_4_ = (int)auVar269._20_4_;
                auVar175._24_4_ = (int)auVar269._24_4_;
                auVar175._28_4_ = (int)auVar269._28_4_;
                auVar208 = vpslld_avx(auVar138,0x17);
                auVar136 = vpslld_avx(auVar175._16_16_,0x17);
                auVar61._8_4_ = 0x3f800000;
                auVar61._0_8_ = 0x3f8000003f800000;
                auVar61._12_4_ = 0x3f800000;
                auVar136 = vpaddd_avx(auVar136,auVar61);
                auVar208 = vpaddd_avx(auVar208,auVar61);
                auVar128._0_4_ =
                     (fVar248 + fVar46 + fVar248 * fVar248 * fVar135) * auVar208._0_4_ + fVar46;
                auVar128._4_4_ =
                     (fVar249 + fVar60 + fVar249 * fVar249 * fVar182) * auVar208._4_4_ + fVar60;
                auVar128._8_4_ =
                     (fVar250 + fVar87 + fVar250 * fVar250 * fVar183) * auVar208._8_4_ + fVar87;
                auVar128._12_4_ =
                     (fVar251 + fVar88 + fVar251 * fVar251 * fVar184) * auVar208._12_4_ + fVar88;
                auVar128._16_4_ =
                     (fVar252 + fVar190 + fVar252 * fVar252 * fVar185) * auVar136._0_4_ + fVar190;
                auVar128._20_4_ =
                     (fVar253 + fVar89 + fVar253 * fVar253 * fVar186) * auVar136._4_4_ + fVar89;
                auVar128._24_4_ =
                     (fVar298 + fVar187 + fVar298 * fVar298 * fVar188) * auVar136._8_4_ + fVar187;
                auVar128._28_4_ = auVar79._28_4_ + fVar189 + auVar53._28_4_ + fVar189;
                auVar206 = vrcpps_avx(auVar128);
                fVar46 = auVar206._0_4_;
                fVar60 = auVar206._4_4_;
                fVar87 = auVar206._8_4_;
                fVar88 = auVar206._12_4_;
                fVar190 = auVar206._16_4_;
                fVar89 = auVar206._20_4_;
                fVar187 = auVar206._24_4_;
                auVar18._4_4_ = auVar128._4_4_ * (fVar60 + fVar60);
                auVar18._0_4_ = auVar128._0_4_ * (fVar46 + fVar46);
                auVar18._8_4_ = auVar128._8_4_ * (fVar87 + fVar87);
                auVar18._12_4_ = auVar128._12_4_ * (fVar88 + fVar88);
                auVar18._16_4_ = auVar128._16_4_ * (fVar190 + fVar190);
                auVar18._20_4_ = auVar128._20_4_ * (fVar89 + fVar89);
                auVar18._24_4_ = auVar128._24_4_ * (fVar187 + fVar187);
                auVar18._28_4_ = auVar128._28_4_;
                auVar80._8_4_ = 0x40000000;
                auVar80._0_8_ = 0x4000000040000000;
                auVar80._12_4_ = 0x40000000;
                auVar80._16_4_ = 0x40000000;
                auVar80._20_4_ = 0x40000000;
                auVar80._24_4_ = 0x40000000;
                auVar80._28_4_ = 0x40000000;
                auVar269 = vsubps_avx(auVar80,auVar18);
                auVar176._0_4_ = fVar46 + fVar46 + -1.0;
                auVar176._4_4_ = fVar60 + fVar60 + -1.0;
                auVar176._8_4_ = fVar87 + fVar87 + -1.0;
                auVar176._12_4_ = fVar88 + fVar88 + -1.0;
                auVar176._16_4_ = fVar190 + fVar190 + -1.0;
                auVar176._20_4_ = fVar89 + fVar89 + -1.0;
                auVar176._24_4_ = fVar187 + fVar187 + -1.0;
                auVar176._28_4_ = auVar206._28_4_ + auVar206._28_4_ + -1.0;
                auVar118._0_4_ = auVar176._0_4_ + fVar46 * auVar269._0_4_;
                auVar118._4_4_ = auVar176._4_4_ + fVar60 * auVar269._4_4_;
                auVar118._8_4_ = auVar176._8_4_ + fVar87 * auVar269._8_4_;
                auVar118._12_4_ = auVar176._12_4_ + fVar88 * auVar269._12_4_;
                auVar118._16_4_ = auVar176._16_4_ + fVar190 * auVar269._16_4_;
                auVar118._20_4_ = auVar176._20_4_ + fVar89 * auVar269._20_4_;
                auVar118._24_4_ = auVar176._24_4_ + fVar187 * auVar269._24_4_;
                goto LAB_0031358a;
              case 6:
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar60 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar176._4_4_ = fVar60;
                auVar176._0_4_ = fVar60;
                auVar176._8_4_ = fVar60;
                auVar176._12_4_ = fVar60;
                auVar176._16_4_ = fVar60;
                auVar176._20_4_ = fVar60;
                auVar176._24_4_ = fVar60;
                auVar176._28_4_ = fVar60;
                auVar130._0_4_ = auVar275._0_4_ * fVar46 + fVar60;
                auVar130._4_4_ = auVar275._4_4_ * fVar46 + fVar60;
                auVar130._8_4_ = fVar294 * fVar46 + fVar60;
                auVar130._12_4_ = fVar295 * fVar46 + fVar60;
                auVar130._16_4_ = fVar296 * fVar46 + fVar60;
                auVar130._20_4_ = fVar297 * fVar46 + fVar60;
                auVar130._24_4_ = fVar207 * fVar46 + fVar60;
                auVar130._28_4_ = fVar46 + fVar60;
                auVar269 = vmaxps_avx(auVar130,auVar86._0_32_);
                auVar206 = vminps_avx(auVar269,auVar206);
                auVar118 = auVar206._0_28_;
LAB_0031358a:
                in_ZMM3 = ZEXT3264(auVar176);
                auVar276._0_4_ = auVar275._0_4_ * auVar118._0_4_;
                auVar276._4_4_ = auVar275._4_4_ * auVar118._4_4_;
                auVar276._8_4_ = fVar294 * auVar118._8_4_;
                auVar276._12_4_ = fVar295 * auVar118._12_4_;
                auVar276._16_4_ = fVar296 * auVar118._16_4_;
                auVar276._20_4_ = fVar297 * auVar118._20_4_;
                auVar276._24_4_ = fVar207 * auVar118._24_4_;
                auVar271 = auVar276._0_32_;
              }
              *pauVar38 = auVar271;
              pauVar38 = pauVar38 + 1;
              bVar45 = iVar42 != iVar3;
              iVar42 = iVar42 + 1;
            } while (bVar45);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != _h);
      }
      if ((local_e0 == 0 && uVar2 == 4) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_110 = 0;
        auVar86 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar274 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar264 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar260._8_4_ = 0x42b0c0a5;
        auVar260._0_8_ = 0x42b0c0a542b0c0a5;
        auVar260._12_4_ = 0x42b0c0a5;
        auVar260._16_4_ = 0x42b0c0a5;
        auVar260._20_4_ = 0x42b0c0a5;
        auVar260._24_4_ = 0x42b0c0a5;
        auVar260._28_4_ = 0x42b0c0a5;
        auVar263._8_4_ = 0xc2b0c0a5;
        auVar263._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar263._12_4_ = 0xc2b0c0a5;
        auVar263._16_4_ = 0xc2b0c0a5;
        auVar263._20_4_ = 0xc2b0c0a5;
        auVar263._24_4_ = 0xc2b0c0a5;
        auVar263._28_4_ = 0xc2b0c0a5;
        do {
          if (-1 < iVar3) {
            pauVar38 = (undefined1 (*) [32])
                       ((long)top_blob->w * local_110 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar40 = 0;
            iVar42 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar275 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar275 = ZEXT3264(*(undefined1 (*) [32])
                                     (*(long *)(&this->field_0x190 + (long)p_Var4) +
                                     local_110 * 0x20));
              }
              if (0 < iVar27) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * local_110 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                pfVar35 = (float *)((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator
                                   + (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar40) * 4
                                     + 4);
                uVar39 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar31 = pfVar35;
                    iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      fVar46 = pfVar31[-3];
                      fVar60 = pfVar31[-2];
                      fVar87 = pfVar31[-1];
                      fVar88 = *pfVar31;
                      in_ZMM7 = ZEXT3264(CONCAT428(fVar88,CONCAT424(fVar88,CONCAT420(fVar88,
                                                  CONCAT416(fVar88,CONCAT412(fVar88,CONCAT48(fVar88,
                                                  CONCAT44(fVar88,fVar88))))))));
                      fVar190 = fVar60 + fVar87;
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar190,CONCAT424(fVar88 * pfVar43[0x1e],
                                                                     CONCAT420(fVar88 * pfVar43[0x1d
                                                  ],CONCAT416(fVar88 * pfVar43[0x1c],
                                                              CONCAT412(fVar88 * pfVar43[0x1b],
                                                                        CONCAT48(fVar88 * pfVar43[
                                                  0x1a],CONCAT44(fVar88 * pfVar43[0x19],
                                                                 fVar88 * pfVar43[0x18]))))))));
                      auVar275 = ZEXT3264(CONCAT428(auVar275._28_4_ + fVar46 + fVar190 + fVar190,
                                                    CONCAT424(auVar275._24_4_ + fVar46 * pfVar43[6]
                                                              + fVar60 * pfVar43[0xe] +
                                                                fVar87 * pfVar43[0x16] +
                                                              fVar88 * pfVar43[0x1e],
                                                              CONCAT420(auVar275._20_4_ +
                                                                        fVar46 * pfVar43[5] +
                                                                        fVar60 * pfVar43[0xd] +
                                                                        fVar87 * pfVar43[0x15] +
                                                                        fVar88 * pfVar43[0x1d],
                                                                        CONCAT416(auVar275._16_4_ +
                                                                                  fVar46 * pfVar43[4
                                                  ] + fVar60 * pfVar43[0xc] + fVar87 * pfVar43[0x14]
                                                  + fVar88 * pfVar43[0x1c],
                                                  CONCAT412(auVar275._12_4_ + fVar46 * pfVar43[3] +
                                                            fVar60 * pfVar43[0xb] +
                                                            fVar87 * pfVar43[0x13] +
                                                            fVar88 * pfVar43[0x1b],
                                                            CONCAT48(auVar275._8_4_ +
                                                                     fVar46 * pfVar43[2] +
                                                                     fVar60 * pfVar43[10] +
                                                                     fVar87 * pfVar43[0x12] +
                                                                     fVar88 * pfVar43[0x1a],
                                                                     CONCAT44(auVar275._4_4_ +
                                                                              fVar46 * pfVar43[1] +
                                                                              fVar60 * pfVar43[9] +
                                                                              fVar87 * pfVar43[0x11]
                                                                              + fVar88 * pfVar43[
                                                  0x19],auVar275._0_4_ + fVar46 * *pfVar43 +
                                                        fVar60 * pfVar43[8] + fVar87 * pfVar43[0x10]
                                                        + fVar88 * pfVar43[0x18]))))))));
                      pfVar43 = pfVar43 + 0x20;
                      pfVar31 = pfVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 2);
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  uVar39 = uVar39 + 1;
                  pfVar35 = (float *)((long)pfVar35 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar39 != uVar41);
              }
              auVar273 = auVar275._0_32_;
              p_Var4 = pp_Var5[-3];
              fVar294 = auVar275._8_4_;
              fVar295 = auVar275._12_4_;
              fVar296 = auVar275._16_4_;
              fVar297 = auVar275._20_4_;
              fVar207 = auVar275._24_4_;
              fVar135 = auVar274._0_4_;
              fVar182 = auVar274._4_4_;
              fVar183 = auVar274._8_4_;
              fVar184 = auVar274._12_4_;
              fVar185 = auVar274._16_4_;
              fVar186 = auVar274._20_4_;
              fVar188 = auVar274._24_4_;
              fVar293 = auVar274._28_4_;
              auVar206 = auVar264._0_32_;
              fVar46 = auVar264._0_4_;
              fVar60 = auVar264._4_4_;
              fVar87 = auVar264._8_4_;
              fVar88 = auVar264._12_4_;
              fVar190 = auVar264._16_4_;
              fVar89 = auVar264._20_4_;
              fVar187 = auVar264._24_4_;
              fVar189 = auVar264._28_4_;
              auVar277._28_36_ = auVar275._28_36_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar273 = vmaxps_avx(auVar273,auVar86._0_32_);
                break;
              case 2:
                auVar206 = vmaxps_avx(auVar273,ZEXT1632(ZEXT816(0) << 0x40));
                in_ZMM7 = ZEXT3264(auVar206);
                auVar86 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar269 = vminps_avx(auVar273,ZEXT1632(ZEXT816(0) << 0x40));
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar273._0_4_ = fVar46 * auVar269._0_4_ + auVar206._0_4_;
                auVar273._4_4_ = fVar46 * auVar269._4_4_ + auVar206._4_4_;
                auVar273._8_4_ = fVar46 * auVar269._8_4_ + auVar206._8_4_;
                auVar273._12_4_ = fVar46 * auVar269._12_4_ + auVar206._12_4_;
                auVar273._16_4_ = fVar46 * auVar269._16_4_ + auVar206._16_4_;
                auVar273._20_4_ = fVar46 * auVar269._20_4_ + auVar206._20_4_;
                auVar273._24_4_ = fVar46 * auVar269._24_4_ + auVar206._24_4_;
                auVar273._28_4_ = auVar269._28_4_ + auVar206._28_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar245._4_4_ = uVar1;
                auVar245._0_4_ = uVar1;
                auVar245._8_4_ = uVar1;
                auVar245._12_4_ = uVar1;
                auVar245._16_4_ = uVar1;
                auVar245._20_4_ = uVar1;
                auVar245._24_4_ = uVar1;
                auVar245._28_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar292._4_4_ = uVar1;
                auVar292._0_4_ = uVar1;
                auVar292._8_4_ = uVar1;
                auVar292._12_4_ = uVar1;
                auVar292._16_4_ = uVar1;
                auVar292._20_4_ = uVar1;
                auVar292._24_4_ = uVar1;
                auVar292._28_4_ = uVar1;
                auVar206 = vmaxps_avx(auVar273,auVar245);
                in_ZMM7 = ZEXT3264(auVar206);
                auVar273 = vminps_avx(auVar292,auVar206);
                break;
              case 4:
                auVar246._0_8_ = auVar275._0_8_ ^ 0x8000000080000000;
                auVar246._8_4_ = -fVar294;
                auVar246._12_4_ = -fVar295;
                auVar246._16_4_ = -fVar296;
                auVar246._20_4_ = -fVar297;
                auVar246._24_4_ = -fVar207;
                auVar246._28_4_ = -auVar275._28_4_;
                auVar84._8_4_ = 0x42b0c0a5;
                auVar84._0_8_ = 0x42b0c0a542b0c0a5;
                auVar84._12_4_ = 0x42b0c0a5;
                auVar84._16_4_ = 0x42b0c0a5;
                auVar84._20_4_ = 0x42b0c0a5;
                auVar84._24_4_ = 0x42b0c0a5;
                auVar84._28_4_ = 0x42b0c0a5;
                auVar269 = vminps_avx(auVar246,auVar84);
                auVar85._8_4_ = 0xc2b0c0a5;
                auVar85._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar85._12_4_ = 0xc2b0c0a5;
                auVar85._16_4_ = 0xc2b0c0a5;
                auVar85._20_4_ = 0xc2b0c0a5;
                auVar85._24_4_ = 0xc2b0c0a5;
                auVar85._28_4_ = 0xc2b0c0a5;
                auVar79 = vmaxps_avx(auVar269,auVar85);
                auVar272._0_4_ = auVar79._0_4_ * 1.442695 + fVar135;
                auVar272._4_4_ = auVar79._4_4_ * 1.442695 + fVar182;
                auVar272._8_4_ = auVar79._8_4_ * 1.442695 + fVar183;
                auVar272._12_4_ = auVar79._12_4_ * 1.442695 + fVar184;
                auVar272._16_4_ = auVar79._16_4_ * 1.442695 + fVar185;
                auVar272._20_4_ = auVar79._20_4_ * 1.442695 + fVar186;
                auVar272._24_4_ = auVar79._24_4_ * 1.442695 + fVar188;
                auVar272._28_4_ = auVar275._28_4_ + fVar293;
                auVar53 = vroundps_avx(auVar272,1);
                auVar269 = vcmpps_avx(auVar272,auVar53,1);
                auVar269 = vandps_avx(auVar269,auVar206);
                auVar269 = vsubps_avx(auVar53,auVar269);
                fVar294 = auVar269._0_4_ * -0.6931472 + auVar79._0_4_;
                fVar295 = auVar269._4_4_ * -0.6931472 + auVar79._4_4_;
                fVar296 = auVar269._8_4_ * -0.6931472 + auVar79._8_4_;
                fVar297 = auVar269._12_4_ * -0.6931472 + auVar79._12_4_;
                fVar207 = auVar269._16_4_ * -0.6931472 + auVar79._16_4_;
                fVar248 = auVar269._20_4_ * -0.6931472 + auVar79._20_4_;
                fVar249 = auVar269._24_4_ * -0.6931472 + auVar79._24_4_;
                auVar211._0_4_ = (int)auVar269._0_4_;
                auVar211._4_4_ = (int)auVar269._4_4_;
                auVar211._8_4_ = (int)auVar269._8_4_;
                auVar211._12_4_ = (int)auVar269._12_4_;
                auVar247._16_4_ = (int)auVar269._16_4_;
                auVar247._0_16_ = auVar211;
                auVar247._20_4_ = (int)auVar269._20_4_;
                auVar247._24_4_ = (int)auVar269._24_4_;
                auVar247._28_4_ = (int)auVar269._28_4_;
                auVar208 = vpslld_avx(auVar211,0x17);
                auVar136 = vpslld_avx(auVar247._16_16_,0x17);
                auVar64._8_4_ = 0x3f800000;
                auVar64._0_8_ = 0x3f8000003f800000;
                auVar64._12_4_ = 0x3f800000;
                auVar136 = vpaddd_avx(auVar136,auVar64);
                auVar208 = vpaddd_avx(auVar208,auVar64);
                auVar133._0_4_ =
                     (fVar294 + fVar46 +
                     fVar294 * fVar294 *
                     (fVar135 +
                     ((((fVar294 * 0.00019875691 + 0.0013981999) * fVar294 + 0.008333452) * fVar294
                      + 0.041665796) * fVar294 + 0.16666666) * fVar294)) * auVar208._0_4_ + fVar46;
                auVar133._4_4_ =
                     (fVar295 + fVar60 +
                     fVar295 * fVar295 *
                     (fVar182 +
                     ((((fVar295 * 0.00019875691 + 0.0013981999) * fVar295 + 0.008333452) * fVar295
                      + 0.041665796) * fVar295 + 0.16666666) * fVar295)) * auVar208._4_4_ + fVar60;
                auVar133._8_4_ =
                     (fVar296 + fVar87 +
                     fVar296 * fVar296 *
                     (fVar183 +
                     ((((fVar296 * 0.00019875691 + 0.0013981999) * fVar296 + 0.008333452) * fVar296
                      + 0.041665796) * fVar296 + 0.16666666) * fVar296)) * auVar208._8_4_ + fVar87;
                auVar133._12_4_ =
                     (fVar297 + fVar88 +
                     fVar297 * fVar297 *
                     (fVar184 +
                     ((((fVar297 * 0.00019875691 + 0.0013981999) * fVar297 + 0.008333452) * fVar297
                      + 0.041665796) * fVar297 + 0.16666666) * fVar297)) * auVar208._12_4_ + fVar88;
                auVar133._16_4_ =
                     (fVar207 + fVar190 +
                     fVar207 * fVar207 *
                     (fVar185 +
                     ((((fVar207 * 0.00019875691 + 0.0013981999) * fVar207 + 0.008333452) * fVar207
                      + 0.041665796) * fVar207 + 0.16666666) * fVar207)) * auVar136._0_4_ + fVar190;
                auVar133._20_4_ =
                     (fVar248 + fVar89 +
                     fVar248 * fVar248 *
                     (fVar186 +
                     ((((fVar248 * 0.00019875691 + 0.0013981999) * fVar248 + 0.008333452) * fVar248
                      + 0.041665796) * fVar248 + 0.16666666) * fVar248)) * auVar136._4_4_ + fVar89;
                auVar133._24_4_ =
                     (fVar249 + fVar187 +
                     fVar249 * fVar249 *
                     (fVar188 +
                     ((((fVar249 * 0.00019875691 + 0.0013981999) * fVar249 + 0.008333452) * fVar249
                      + 0.041665796) * fVar249 + 0.16666666) * fVar249)) * auVar136._8_4_ + fVar187;
                auVar133._28_4_ =
                     auVar53._28_4_ + auVar79._28_4_ + fVar189 + fVar293 + -0.47508308 + fVar189;
                auVar269 = vrcpps_avx(auVar133);
                in_ZMM7 = ZEXT3264(auVar269);
                fVar46 = auVar269._0_4_;
                fVar60 = auVar269._4_4_;
                auVar24._4_4_ = auVar133._4_4_ * fVar60;
                auVar24._0_4_ = auVar133._0_4_ * fVar46;
                fVar87 = auVar269._8_4_;
                auVar24._8_4_ = auVar133._8_4_ * fVar87;
                fVar88 = auVar269._12_4_;
                auVar24._12_4_ = auVar133._12_4_ * fVar88;
                fVar190 = auVar269._16_4_;
                auVar24._16_4_ = auVar133._16_4_ * fVar190;
                fVar89 = auVar269._20_4_;
                auVar24._20_4_ = auVar133._20_4_ * fVar89;
                fVar187 = auVar269._24_4_;
                auVar24._24_4_ = auVar133._24_4_ * fVar187;
                auVar24._28_4_ = auVar133._28_4_;
                auVar206 = vsubps_avx(auVar206,auVar24);
                auVar273._0_4_ = fVar46 + fVar46 * auVar206._0_4_;
                auVar273._4_4_ = fVar60 + fVar60 * auVar206._4_4_;
                auVar273._8_4_ = fVar87 + fVar87 * auVar206._8_4_;
                auVar273._12_4_ = fVar88 + fVar88 * auVar206._12_4_;
                auVar273._16_4_ = fVar190 + fVar190 * auVar206._16_4_;
                auVar273._20_4_ = fVar89 + fVar89 * auVar206._20_4_;
                auVar273._24_4_ = fVar187 + fVar187 * auVar206._24_4_;
                auVar273._28_4_ = auVar269._28_4_ + auVar206._28_4_;
                break;
              case 5:
                auVar269 = vminps_avx(auVar273,auVar260);
                auVar79 = vmaxps_avx(auVar263,auVar269);
                auVar243._0_4_ = fVar135 + auVar79._0_4_ * 1.442695;
                auVar243._4_4_ = fVar182 + auVar79._4_4_ * 1.442695;
                auVar243._8_4_ = fVar183 + auVar79._8_4_ * 1.442695;
                auVar243._12_4_ = fVar184 + auVar79._12_4_ * 1.442695;
                auVar243._16_4_ = fVar185 + auVar79._16_4_ * 1.442695;
                auVar243._20_4_ = fVar186 + auVar79._20_4_ * 1.442695;
                auVar243._24_4_ = fVar188 + auVar79._24_4_ * 1.442695;
                auVar243._28_4_ = fVar293 + in_ZMM7._28_4_;
                auVar53 = vroundps_avx(auVar243,1);
                auVar269 = vcmpps_avx(auVar243,auVar53,1);
                auVar269 = vandps_avx(auVar269,auVar206);
                auVar269 = vsubps_avx(auVar53,auVar269);
                auVar20._4_4_ = auVar269._4_4_ * 0.6931472;
                auVar20._0_4_ = auVar269._0_4_ * 0.6931472;
                auVar20._8_4_ = auVar269._8_4_ * 0.6931472;
                auVar20._12_4_ = auVar269._12_4_ * 0.6931472;
                auVar20._16_4_ = auVar269._16_4_ * 0.6931472;
                auVar20._20_4_ = auVar269._20_4_ * 0.6931472;
                auVar20._24_4_ = auVar269._24_4_ * 0.6931472;
                auVar20._28_4_ = auVar53._28_4_;
                auVar79 = vsubps_avx(auVar79,auVar20);
                fVar248 = auVar79._0_4_;
                fVar249 = auVar79._4_4_;
                fVar250 = auVar79._8_4_;
                fVar251 = auVar79._12_4_;
                fVar252 = auVar79._16_4_;
                fVar253 = auVar79._20_4_;
                fVar298 = auVar79._24_4_;
                auVar139._0_4_ = (int)auVar269._0_4_;
                auVar139._4_4_ = (int)auVar269._4_4_;
                auVar139._8_4_ = (int)auVar269._8_4_;
                auVar139._12_4_ = (int)auVar269._12_4_;
                auVar177._16_4_ = (int)auVar269._16_4_;
                auVar177._0_16_ = auVar139;
                auVar177._20_4_ = (int)auVar269._20_4_;
                auVar177._24_4_ = (int)auVar269._24_4_;
                auVar177._28_4_ = (int)auVar269._28_4_;
                auVar208 = vpslld_avx(auVar139,0x17);
                auVar136 = vpslld_avx(auVar177._16_16_,0x17);
                auVar201._8_4_ = 0x3f800000;
                auVar201._0_8_ = 0x3f8000003f800000;
                auVar201._12_4_ = 0x3f800000;
                auVar136 = vpaddd_avx(auVar136,auVar201);
                auVar208 = vpaddd_avx(auVar208,auVar201);
                auVar244._0_4_ =
                     (fVar248 + fVar46 +
                     fVar248 * fVar248 *
                     (((((fVar248 * 0.00019875691 + 0.0013981999) * fVar248 + 0.008333452) * fVar248
                       + 0.041665796) * fVar248 + 0.16666666) * fVar248 + fVar135)) * auVar208._0_4_
                     + fVar46;
                auVar244._4_4_ =
                     (fVar249 + fVar60 +
                     fVar249 * fVar249 *
                     (((((fVar249 * 0.00019875691 + 0.0013981999) * fVar249 + 0.008333452) * fVar249
                       + 0.041665796) * fVar249 + 0.16666666) * fVar249 + fVar182)) * auVar208._4_4_
                     + fVar60;
                auVar244._8_4_ =
                     (fVar250 + fVar87 +
                     fVar250 * fVar250 *
                     (((((fVar250 * 0.00019875691 + 0.0013981999) * fVar250 + 0.008333452) * fVar250
                       + 0.041665796) * fVar250 + 0.16666666) * fVar250 + fVar183)) * auVar208._8_4_
                     + fVar87;
                auVar244._12_4_ =
                     (fVar251 + fVar88 +
                     fVar251 * fVar251 *
                     (((((fVar251 * 0.00019875691 + 0.0013981999) * fVar251 + 0.008333452) * fVar251
                       + 0.041665796) * fVar251 + 0.16666666) * fVar251 + fVar184)) *
                     auVar208._12_4_ + fVar88;
                auVar244._16_4_ =
                     (fVar252 + fVar190 +
                     fVar252 * fVar252 *
                     (((((fVar252 * 0.00019875691 + 0.0013981999) * fVar252 + 0.008333452) * fVar252
                       + 0.041665796) * fVar252 + 0.16666666) * fVar252 + fVar185)) * auVar136._0_4_
                     + fVar190;
                auVar244._20_4_ =
                     (fVar253 + fVar89 +
                     fVar253 * fVar253 *
                     (((((fVar253 * 0.00019875691 + 0.0013981999) * fVar253 + 0.008333452) * fVar253
                       + 0.041665796) * fVar253 + 0.16666666) * fVar253 + fVar186)) * auVar136._4_4_
                     + fVar89;
                auVar244._24_4_ =
                     (fVar298 + fVar187 +
                     fVar298 * fVar298 *
                     (((((fVar298 * 0.00019875691 + 0.0013981999) * fVar298 + 0.008333452) * fVar298
                       + 0.041665796) * fVar298 + 0.16666666) * fVar298 + fVar188)) * auVar136._8_4_
                     + fVar187;
                auVar244._28_4_ =
                     auVar79._28_4_ + fVar189 +
                     in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                     fVar293 + fVar189;
                auVar57._8_4_ = 0x800000;
                auVar57._0_8_ = 0x80000000800000;
                auVar57._12_4_ = 0x800000;
                auVar57._16_4_ = 0x800000;
                auVar57._20_4_ = 0x800000;
                auVar57._24_4_ = 0x800000;
                auVar57._28_4_ = 0x800000;
                auVar53 = vmaxps_avx(auVar244,auVar57);
                auVar136 = vpsrld_avx(auVar53._16_16_,0x17);
                auVar58._8_4_ = 0x807fffff;
                auVar58._0_8_ = 0x807fffff807fffff;
                auVar58._12_4_ = 0x807fffff;
                auVar58._16_4_ = 0x807fffff;
                auVar58._20_4_ = 0x807fffff;
                auVar58._24_4_ = 0x807fffff;
                auVar58._28_4_ = 0x807fffff;
                auVar269 = vandps_avx(auVar53,auVar58);
                auVar126 = vorps_avx(auVar269,auVar274._0_32_);
                auVar59._8_4_ = 0x3f3504f3;
                auVar59._0_8_ = 0x3f3504f33f3504f3;
                auVar59._12_4_ = 0x3f3504f3;
                auVar59._16_4_ = 0x3f3504f3;
                auVar59._20_4_ = 0x3f3504f3;
                auVar59._24_4_ = 0x3f3504f3;
                auVar59._28_4_ = 0x3f3504f3;
                auVar79 = vcmpps_avx(auVar59,auVar126,2);
                auVar269 = vandnps_avx(auVar79,auVar126);
                fVar248 = auVar126._0_4_ + -1.0 + auVar269._0_4_;
                fVar249 = auVar126._4_4_ + -1.0 + auVar269._4_4_;
                fVar250 = auVar126._8_4_ + -1.0 + auVar269._8_4_;
                fVar251 = auVar126._12_4_ + -1.0 + auVar269._12_4_;
                fVar252 = auVar126._16_4_ + -1.0 + auVar269._16_4_;
                fVar253 = auVar126._20_4_ + -1.0 + auVar269._20_4_;
                fVar298 = auVar126._24_4_ + -1.0 + auVar269._24_4_;
                auVar136 = vpsubd_avx(auVar136,auVar79._16_16_);
                auVar208 = vpsrld_avx(auVar53._0_16_,0x17);
                auVar49._8_4_ = 0xffffff81;
                auVar49._0_8_ = 0xffffff81ffffff81;
                auVar49._12_4_ = 0xffffff81;
                auVar136 = vpaddd_avx(auVar136,auVar49);
                auVar208 = vpsubd_avx(auVar208,auVar79._0_16_);
                auVar208 = vpaddd_avx(auVar208,auVar49);
                auVar131._16_16_ = auVar136;
                auVar131._0_16_ = auVar208;
                auVar86 = ZEXT864(0) << 0x20;
                auVar79 = vcmpps_avx(auVar244,ZEXT832(0) << 0x20,2);
                auVar53 = vcvtdq2ps_avx(auVar131);
                auVar21._4_4_ =
                     (fVar249 + auVar53._4_4_ * 0.6931472 +
                     fVar249 * fVar249 *
                     (fVar249 * (fVar249 * (fVar249 * (fVar249 * (fVar249 * (fVar249 * (fVar249 * (
                                                  fVar249 * (fVar249 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar21._0_4_ =
                     (fVar248 + auVar53._0_4_ * 0.6931472 +
                     fVar248 * fVar248 *
                     (fVar248 * (fVar248 * (fVar248 * (fVar248 * (fVar248 * (fVar248 * (fVar248 * (
                                                  fVar248 * (fVar248 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar21._8_4_ =
                     (fVar250 + auVar53._8_4_ * 0.6931472 +
                     fVar250 * fVar250 *
                     (fVar250 * (fVar250 * (fVar250 * (fVar250 * (fVar250 * (fVar250 * (fVar250 * (
                                                  fVar250 * (fVar250 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar21._12_4_ =
                     (fVar251 + auVar53._12_4_ * 0.6931472 +
                     fVar251 * fVar251 *
                     (fVar251 * (fVar251 * (fVar251 * (fVar251 * (fVar251 * (fVar251 * (fVar251 * (
                                                  fVar251 * (fVar251 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar21._16_4_ =
                     (fVar252 + auVar53._16_4_ * 0.6931472 +
                     fVar252 * fVar252 *
                     (fVar252 * (fVar252 * (fVar252 * (fVar252 * (fVar252 * (fVar252 * (fVar252 * (
                                                  fVar252 * (fVar252 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar21._20_4_ =
                     (fVar253 + auVar53._20_4_ * 0.6931472 +
                     fVar253 * fVar253 *
                     (fVar253 * (fVar253 * (fVar253 * (fVar253 * (fVar253 * (fVar253 * (fVar253 * (
                                                  fVar253 * (fVar253 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar21._24_4_ =
                     (fVar298 + auVar53._24_4_ * 0.6931472 +
                     fVar298 * fVar298 *
                     (fVar298 * (fVar298 * (fVar298 * (fVar298 * (fVar298 * (fVar298 * (fVar298 * (
                                                  fVar298 * (fVar298 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar21._28_4_ = auVar126._28_4_ + -1.0 + auVar269._28_4_ + auVar53._28_4_ + 0.0;
                auVar178._8_4_ = 0x7fffffff;
                auVar178._0_8_ = 0x7fffffff7fffffff;
                auVar178._12_4_ = 0x7fffffff;
                auVar178._16_4_ = 0x7fffffff;
                auVar178._20_4_ = 0x7fffffff;
                auVar178._24_4_ = 0x7fffffff;
                auVar178._28_4_ = 0x7fffffff;
                auVar269 = vblendvps_avx(auVar21,auVar178,auVar79);
                auVar269 = vminps_avx(auVar260,auVar269);
                auVar79 = vmaxps_avx(auVar263,auVar269);
                auVar179._0_4_ = auVar79._0_4_ * 1.442695 + fVar135;
                auVar179._4_4_ = auVar79._4_4_ * 1.442695 + fVar182;
                auVar179._8_4_ = auVar79._8_4_ * 1.442695 + fVar183;
                auVar179._12_4_ = auVar79._12_4_ * 1.442695 + fVar184;
                auVar179._16_4_ = auVar79._16_4_ * 1.442695 + fVar185;
                auVar179._20_4_ = auVar79._20_4_ * 1.442695 + fVar186;
                auVar179._24_4_ = auVar79._24_4_ * 1.442695 + fVar188;
                auVar179._28_4_ = fVar293 + NAN;
                auVar53 = vroundps_avx(auVar179,1);
                auVar269 = vcmpps_avx(auVar179,auVar53,1);
                auVar269 = vandps_avx(auVar269,auVar206);
                auVar269 = vsubps_avx(auVar53,auVar269);
                auVar22._4_4_ = auVar269._4_4_ * 0.6931472;
                auVar22._0_4_ = auVar269._0_4_ * 0.6931472;
                auVar22._8_4_ = auVar269._8_4_ * 0.6931472;
                auVar22._12_4_ = auVar269._12_4_ * 0.6931472;
                auVar22._16_4_ = auVar269._16_4_ * 0.6931472;
                auVar22._20_4_ = auVar269._20_4_ * 0.6931472;
                auVar22._24_4_ = auVar269._24_4_ * 0.6931472;
                auVar22._28_4_ = auVar53._28_4_;
                auVar79 = vsubps_avx(auVar79,auVar22);
                fVar248 = auVar79._0_4_;
                fVar249 = auVar79._4_4_;
                fVar250 = auVar79._8_4_;
                fVar251 = auVar79._12_4_;
                fVar252 = auVar79._16_4_;
                fVar253 = auVar79._20_4_;
                fVar298 = auVar79._24_4_;
                auVar264 = ZEXT3264(auVar206);
                auVar274 = ZEXT3264(auVar274._0_32_);
                fVar135 = fVar135 + ((((fVar248 * 0.00019875691 + 0.0013981999) * fVar248 +
                                      0.008333452) * fVar248 + 0.041665796) * fVar248 + 0.16666666)
                                    * fVar248;
                fVar182 = fVar182 + ((((fVar249 * 0.00019875691 + 0.0013981999) * fVar249 +
                                      0.008333452) * fVar249 + 0.041665796) * fVar249 + 0.16666666)
                                    * fVar249;
                fVar183 = fVar183 + ((((fVar250 * 0.00019875691 + 0.0013981999) * fVar250 +
                                      0.008333452) * fVar250 + 0.041665796) * fVar250 + 0.16666666)
                                    * fVar250;
                fVar184 = fVar184 + ((((fVar251 * 0.00019875691 + 0.0013981999) * fVar251 +
                                      0.008333452) * fVar251 + 0.041665796) * fVar251 + 0.16666666)
                                    * fVar251;
                fVar185 = fVar185 + ((((fVar252 * 0.00019875691 + 0.0013981999) * fVar252 +
                                      0.008333452) * fVar252 + 0.041665796) * fVar252 + 0.16666666)
                                    * fVar252;
                fVar186 = fVar186 + ((((fVar253 * 0.00019875691 + 0.0013981999) * fVar253 +
                                      0.008333452) * fVar253 + 0.041665796) * fVar253 + 0.16666666)
                                    * fVar253;
                fVar188 = fVar188 + ((((fVar298 * 0.00019875691 + 0.0013981999) * fVar298 +
                                      0.008333452) * fVar298 + 0.041665796) * fVar298 + 0.16666666)
                                    * fVar298;
                in_ZMM7 = ZEXT3264(CONCAT428(fVar293 + auVar244._28_4_ + 0.0013981999 + 0.008333452
                                                       + 0.041665796 + 0.16666666,
                                             CONCAT424(fVar188,CONCAT420(fVar186,CONCAT416(fVar185,
                                                  CONCAT412(fVar184,CONCAT48(fVar183,CONCAT44(
                                                  fVar182,fVar135))))))));
                auVar140._0_4_ = (int)auVar269._0_4_;
                auVar140._4_4_ = (int)auVar269._4_4_;
                auVar140._8_4_ = (int)auVar269._8_4_;
                auVar140._12_4_ = (int)auVar269._12_4_;
                auVar180._16_4_ = (int)auVar269._16_4_;
                auVar180._0_16_ = auVar140;
                auVar180._20_4_ = (int)auVar269._20_4_;
                auVar180._24_4_ = (int)auVar269._24_4_;
                auVar180._28_4_ = (int)auVar269._28_4_;
                auVar208 = vpslld_avx(auVar140,0x17);
                auVar136 = vpslld_avx(auVar180._16_16_,0x17);
                auVar63._8_4_ = 0x3f800000;
                auVar63._0_8_ = 0x3f8000003f800000;
                auVar63._12_4_ = 0x3f800000;
                auVar136 = vpaddd_avx(auVar136,auVar63);
                auVar208 = vpaddd_avx(auVar208,auVar63);
                auVar132._0_4_ =
                     (fVar248 + fVar46 + fVar248 * fVar248 * fVar135) * auVar208._0_4_ + fVar46;
                auVar132._4_4_ =
                     (fVar249 + fVar60 + fVar249 * fVar249 * fVar182) * auVar208._4_4_ + fVar60;
                auVar132._8_4_ =
                     (fVar250 + fVar87 + fVar250 * fVar250 * fVar183) * auVar208._8_4_ + fVar87;
                auVar132._12_4_ =
                     (fVar251 + fVar88 + fVar251 * fVar251 * fVar184) * auVar208._12_4_ + fVar88;
                auVar132._16_4_ =
                     (fVar252 + fVar190 + fVar252 * fVar252 * fVar185) * auVar136._0_4_ + fVar190;
                auVar132._20_4_ =
                     (fVar253 + fVar89 + fVar253 * fVar253 * fVar186) * auVar136._4_4_ + fVar89;
                auVar132._24_4_ =
                     (fVar298 + fVar187 + fVar298 * fVar298 * fVar188) * auVar136._8_4_ + fVar187;
                auVar132._28_4_ = auVar79._28_4_ + fVar189 + auVar53._28_4_ + fVar189;
                auVar206 = vrcpps_avx(auVar132);
                fVar46 = auVar206._0_4_;
                fVar60 = auVar206._4_4_;
                fVar87 = auVar206._8_4_;
                fVar88 = auVar206._12_4_;
                fVar190 = auVar206._16_4_;
                fVar89 = auVar206._20_4_;
                fVar187 = auVar206._24_4_;
                auVar23._4_4_ = auVar132._4_4_ * (fVar60 + fVar60);
                auVar23._0_4_ = auVar132._0_4_ * (fVar46 + fVar46);
                auVar23._8_4_ = auVar132._8_4_ * (fVar87 + fVar87);
                auVar23._12_4_ = auVar132._12_4_ * (fVar88 + fVar88);
                auVar23._16_4_ = auVar132._16_4_ * (fVar190 + fVar190);
                auVar23._20_4_ = auVar132._20_4_ * (fVar89 + fVar89);
                auVar23._24_4_ = auVar132._24_4_ * (fVar187 + fVar187);
                auVar23._28_4_ = auVar132._28_4_;
                auVar83._8_4_ = 0x40000000;
                auVar83._0_8_ = 0x4000000040000000;
                auVar83._12_4_ = 0x40000000;
                auVar83._16_4_ = 0x40000000;
                auVar83._20_4_ = 0x40000000;
                auVar83._24_4_ = 0x40000000;
                auVar83._28_4_ = 0x40000000;
                auVar269 = vsubps_avx(auVar83,auVar23);
                auVar181._0_4_ = fVar46 + fVar46 + -1.0;
                auVar181._4_4_ = fVar60 + fVar60 + -1.0;
                auVar181._8_4_ = fVar87 + fVar87 + -1.0;
                auVar181._12_4_ = fVar88 + fVar88 + -1.0;
                auVar181._16_4_ = fVar190 + fVar190 + -1.0;
                auVar181._20_4_ = fVar89 + fVar89 + -1.0;
                auVar181._24_4_ = fVar187 + fVar187 + -1.0;
                auVar181._28_4_ = auVar206._28_4_ + auVar206._28_4_ + -1.0;
                auVar119._0_4_ = auVar181._0_4_ + fVar46 * auVar269._0_4_;
                auVar119._4_4_ = auVar181._4_4_ + fVar60 * auVar269._4_4_;
                auVar119._8_4_ = auVar181._8_4_ + fVar87 * auVar269._8_4_;
                auVar119._12_4_ = auVar181._12_4_ + fVar88 * auVar269._12_4_;
                auVar119._16_4_ = auVar181._16_4_ + fVar190 * auVar269._16_4_;
                auVar119._20_4_ = auVar181._20_4_ + fVar89 * auVar269._20_4_;
                auVar119._24_4_ = auVar181._24_4_ + fVar187 * auVar269._24_4_;
                goto LAB_00313c2c;
              case 6:
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar60 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar181._4_4_ = fVar60;
                auVar181._0_4_ = fVar60;
                auVar181._8_4_ = fVar60;
                auVar181._12_4_ = fVar60;
                auVar181._16_4_ = fVar60;
                auVar181._20_4_ = fVar60;
                auVar181._24_4_ = fVar60;
                auVar181._28_4_ = fVar60;
                auVar134._0_4_ = auVar275._0_4_ * fVar46 + fVar60;
                auVar134._4_4_ = auVar275._4_4_ * fVar46 + fVar60;
                auVar134._8_4_ = fVar294 * fVar46 + fVar60;
                auVar134._12_4_ = fVar295 * fVar46 + fVar60;
                auVar134._16_4_ = fVar296 * fVar46 + fVar60;
                auVar134._20_4_ = fVar297 * fVar46 + fVar60;
                auVar134._24_4_ = fVar207 * fVar46 + fVar60;
                auVar134._28_4_ = fVar46 + fVar60;
                auVar269 = vmaxps_avx(auVar134,auVar86._0_32_);
                auVar206 = vminps_avx(auVar269,auVar206);
                auVar119 = auVar206._0_28_;
LAB_00313c2c:
                in_ZMM3 = ZEXT3264(auVar181);
                auVar277._0_4_ = auVar275._0_4_ * auVar119._0_4_;
                auVar277._4_4_ = auVar275._4_4_ * auVar119._4_4_;
                auVar277._8_4_ = fVar294 * auVar119._8_4_;
                auVar277._12_4_ = fVar295 * auVar119._12_4_;
                auVar277._16_4_ = fVar296 * auVar119._16_4_;
                auVar277._20_4_ = fVar297 * auVar119._20_4_;
                auVar277._24_4_ = fVar207 * auVar119._24_4_;
                auVar273 = auVar277._0_32_;
              }
              *pauVar38 = auVar273;
              pauVar38 = pauVar38 + 1;
              iVar40 = iVar40 + 4;
              bVar45 = iVar42 != iVar3;
              iVar42 = iVar42 + 1;
            } while (bVar45);
          }
          local_110 = local_110 + 1;
        } while (local_110 != _h);
      }
      uVar30 = uVar33 ^ 1;
      if ((uVar30 == 0 && uVar32 == 0) && 0 < (int)_h) {
        local_60 = top_blob->data;
        local_68 = (long)top_blob->w * top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_58 = (ulong)_h;
        uVar39 = 0;
        do {
          pvVar26 = local_60;
          pvVar10 = local_b8.data;
          if (-1 < iVar3) {
            lVar29 = local_68 * uVar39;
            lVar44 = (long)local_b8.w * local_b8.elemsize;
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            sVar7 = (this->weight_data_packed).cstep;
            sVar8 = (this->weight_data_packed).elemsize;
            pvVar9 = (this->weight_data_packed).data;
            iVar42 = 0;
            uVar34 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                fVar46 = 0.0;
              }
              else {
                fVar46 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var4) + uVar39 * 4);
              }
              if (iVar27 < 1) {
                fVar60 = 0.0;
                fVar87 = 0.0;
                fVar88 = 0.0;
                fVar190 = 0.0;
                fVar89 = 0.0;
                fVar187 = 0.0;
                fVar189 = 0.0;
                fVar135 = 0.0;
              }
              else {
                p_Var4 = pp_Var6[-3];
                pfVar35 = (float *)((long)(_func_int ***)pvVar10 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar42) * 4);
                fVar60 = 0.0;
                fVar87 = 0.0;
                fVar88 = 0.0;
                fVar190 = 0.0;
                fVar89 = 0.0;
                fVar187 = 0.0;
                fVar189 = 0.0;
                fVar135 = 0.0;
                uVar36 = 0;
                pfVar43 = (float *)(sVar7 * uVar39 * sVar8 + (long)pvVar9);
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar31 = pfVar35;
                    iVar40 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      fVar60 = *pfVar43 * *pfVar31 + fVar60;
                      fVar87 = pfVar43[1] * pfVar31[1] + fVar87;
                      fVar88 = pfVar43[2] * pfVar31[2] + fVar88;
                      fVar190 = pfVar43[3] * pfVar31[3] + fVar190;
                      fVar89 = pfVar43[4] * pfVar31[4] + fVar89;
                      fVar187 = pfVar43[5] * pfVar31[5] + fVar187;
                      fVar189 = pfVar43[6] * pfVar31[6] + fVar189;
                      fVar135 = pfVar43[7] + fVar135;
                      pfVar43 = pfVar43 + 8;
                      pfVar31 = pfVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 3);
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  uVar36 = uVar36 + 1;
                  pfVar35 = (float *)((long)pfVar35 + lVar44);
                } while (uVar36 != uVar41);
              }
              auVar65._0_4_ = fVar89 + fVar60;
              auVar65._4_4_ = fVar187 + fVar87;
              auVar65._8_4_ = fVar189 + fVar88;
              auVar65._12_4_ = fVar135 + fVar190;
              auVar136 = vshufpd_avx(auVar65,auVar65,1);
              auVar66._0_4_ = auVar136._0_4_ + auVar65._0_4_;
              auVar66._4_4_ = auVar136._4_4_ + auVar65._4_4_;
              auVar66._8_4_ = auVar136._8_4_ + auVar65._8_4_;
              auVar66._12_4_ = auVar136._12_4_ + auVar65._12_4_;
              auVar136 = vmovshdup_avx(auVar66);
              fVar46 = auVar136._0_4_ + fVar46 + auVar66._0_4_;
              p_Var4 = pp_Var5[-3];
              auVar136 = ZEXT416((uint)fVar46);
              fVar60 = fVar46;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar136 = vmaxss_avx(ZEXT416((uint)fVar46),ZEXT416(0));
                fVar60 = auVar136._0_4_;
                break;
              case 2:
                auVar50._0_12_ = ZEXT812(0);
                auVar50._12_4_ = 0;
                auVar136 = vcmpss_avx(auVar50,auVar136,1);
                auVar90._8_4_ = 0x3f800000;
                auVar90._0_8_ = 0x3f8000003f800000;
                auVar90._12_4_ = 0x3f800000;
                auVar136 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar90,auVar136);
                fVar60 = auVar136._0_4_ * fVar46;
                break;
              case 3:
                auVar136 = vmaxss_avx(auVar136,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                auVar136 = vminss_avx(auVar136,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                       )[1]));
                fVar60 = auVar136._0_4_;
                break;
              case 4:
                fVar46 = expf(-fVar46);
                fVar60 = 1.0 / (fVar46 + 1.0);
                break;
              case 5:
                local_48 = auVar136;
                fVar46 = expf(fVar46);
                fVar46 = logf(fVar46 + 1.0);
                fVar46 = tanhf(fVar46);
                fVar60 = fVar46 * (float)local_48._0_4_;
                break;
              case 6:
                fVar87 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar88 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar190 = -fVar88 / fVar87;
                fVar60 = 0.0;
                if ((fVar190 <= fVar46) && (fVar60 = fVar46, fVar46 <= fVar190 + 1.0 / fVar87)) {
                  fVar60 = (fVar87 * fVar46 + fVar88) * fVar46;
                }
              }
              *(float *)((long)pvVar26 + uVar34 * 4 + lVar29) = fVar60;
              uVar34 = uVar34 + 1;
              iVar42 = iVar42 + 8;
            } while (uVar34 != local_50);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != local_58);
      }
      uVar33 = uVar33 ^ 4;
      if ((uVar32 == 0 && uVar33 == 0) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_110 = 0;
        auVar86 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar202._8_4_ = 0x3f000000;
        auVar202._0_8_ = 0x3f0000003f000000;
        auVar202._12_4_ = 0x3f000000;
        auVar203._8_4_ = 0x3f800000;
        auVar203._0_8_ = 0x3f8000003f800000;
        auVar203._12_4_ = 0x3f800000;
        do {
          if (-1 < iVar3) {
            pauVar37 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_110 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar40 = 0;
            iVar42 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar67 = ZEXT816(0) << 0x40;
              }
              else {
                auVar67 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var4) + local_110 * 0x10);
              }
              auVar264 = ZEXT1664(auVar67);
              if (0 < iVar27) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * local_110 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                pfVar35 = (float *)((long)&((Allocator *)((long)local_b8.data + 0x18))->
                                           _vptr_Allocator +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar40) * 4 +
                                   4);
                uVar39 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar31 = pfVar35;
                    iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      fVar46 = pfVar31[-7];
                      fVar60 = pfVar31[-6];
                      fVar87 = pfVar31[-5];
                      fVar88 = pfVar31[-4];
                      fVar190 = pfVar31[-3];
                      fVar89 = pfVar31[-2];
                      fVar187 = pfVar31[-1];
                      fVar189 = *pfVar31;
                      auVar264 = ZEXT1664(CONCAT412(fVar46 * pfVar43[3] + auVar264._12_4_ +
                                                    fVar60 * pfVar43[7] + fVar87 * pfVar43[0xb] +
                                                    fVar88 * pfVar43[0xf] + fVar190 * pfVar43[0x13]
                                                    + fVar89 * pfVar43[0x17] +
                                                    fVar187 * pfVar43[0x1b] +
                                                    fVar189 * pfVar43[0x1f],
                                                    CONCAT48(fVar46 * pfVar43[2] + auVar264._8_4_ +
                                                             fVar60 * pfVar43[6] +
                                                             fVar87 * pfVar43[10] +
                                                             fVar88 * pfVar43[0xe] +
                                                             fVar190 * pfVar43[0x12] +
                                                             fVar89 * pfVar43[0x16] +
                                                             fVar187 * pfVar43[0x1a] +
                                                             fVar189 * pfVar43[0x1e],
                                                             CONCAT44(fVar46 * pfVar43[1] +
                                                                      auVar264._4_4_ +
                                                                      fVar60 * pfVar43[5] +
                                                                      fVar87 * pfVar43[9] +
                                                                      fVar88 * pfVar43[0xd] +
                                                                      fVar190 * pfVar43[0x11] +
                                                                      fVar89 * pfVar43[0x15] +
                                                                      fVar187 * pfVar43[0x19] +
                                                                      fVar189 * pfVar43[0x1d],
                                                                      fVar46 * *pfVar43 +
                                                                      auVar264._0_4_ +
                                                                      fVar60 * pfVar43[4] +
                                                                      fVar87 * pfVar43[8] +
                                                                      fVar88 * pfVar43[0xc] +
                                                                      fVar190 * pfVar43[0x10] +
                                                                      fVar89 * pfVar43[0x14] +
                                                                      fVar187 * pfVar43[0x18] +
                                                                      fVar189 * pfVar43[0x1c]))));
                      pfVar43 = pfVar43 + 0x20;
                      pfVar31 = pfVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 3);
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  auVar67 = auVar264._0_16_;
                  uVar39 = uVar39 + 1;
                  pfVar35 = (float *)((long)pfVar35 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar39 != uVar41);
              }
              p_Var4 = pp_Var5[-3];
              auVar136 = auVar86._0_16_;
              fVar46 = auVar67._4_4_;
              fVar60 = auVar67._8_4_;
              fVar87 = auVar67._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar67 = vmaxps_avx(auVar136,auVar67);
                break;
              case 2:
                auVar208 = vmaxps_avx(auVar136,auVar67);
                auVar136 = vminps_avx(auVar136,auVar67);
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar67._0_4_ = fVar46 * auVar136._0_4_ + auVar208._0_4_;
                auVar67._4_4_ = fVar46 * auVar136._4_4_ + auVar208._4_4_;
                auVar67._8_4_ = fVar46 * auVar136._8_4_ + auVar208._8_4_;
                auVar67._12_4_ = fVar46 * auVar136._12_4_ + auVar208._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar216._4_4_ = uVar1;
                auVar216._0_4_ = uVar1;
                auVar216._8_4_ = uVar1;
                auVar216._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar280._4_4_ = uVar1;
                auVar280._0_4_ = uVar1;
                auVar280._8_4_ = uVar1;
                auVar280._12_4_ = uVar1;
                auVar136 = vmaxps_avx(auVar67,auVar216);
                auVar67 = vminps_avx(auVar280,auVar136);
                break;
              case 4:
                auVar68._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
                auVar68._8_4_ = -fVar60;
                auVar68._12_4_ = -fVar87;
                auVar96._8_4_ = 0x42b0c0a5;
                auVar96._0_8_ = 0x42b0c0a542b0c0a5;
                auVar96._12_4_ = 0x42b0c0a5;
                auVar136 = vminps_avx(auVar68,auVar96);
                auVar97._8_4_ = 0xc2b0c0a5;
                auVar97._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar97._12_4_ = 0xc2b0c0a5;
                auVar199 = vmaxps_avx(auVar136,auVar97);
                auVar217._0_4_ = auVar199._0_4_ * 1.442695 + 0.5;
                auVar217._4_4_ = auVar199._4_4_ * 1.442695 + 0.5;
                auVar217._8_4_ = auVar199._8_4_ * 1.442695 + 0.5;
                auVar217._12_4_ = auVar199._12_4_ * 1.442695 + 0.5;
                auVar281._0_4_ = (int)auVar217._0_4_;
                auVar281._4_4_ = (int)auVar217._4_4_;
                auVar281._8_4_ = (int)auVar217._8_4_;
                auVar281._12_4_ = (int)auVar217._12_4_;
                auVar208 = vcvtdq2ps_avx(auVar281);
                auVar136 = vcmpps_avx(auVar217,auVar208,1);
                auVar136 = vandps_avx(auVar136,auVar203);
                auVar136 = vsubps_avx(auVar208,auVar136);
                fVar46 = auVar136._0_4_ * -0.6931472 + auVar199._0_4_;
                fVar60 = auVar136._4_4_ * -0.6931472 + auVar199._4_4_;
                fVar87 = auVar136._8_4_ * -0.6931472 + auVar199._8_4_;
                fVar88 = auVar136._12_4_ * -0.6931472 + auVar199._12_4_;
                auVar218._0_4_ = (int)auVar136._0_4_;
                auVar218._4_4_ = (int)auVar136._4_4_;
                auVar218._8_4_ = (int)auVar136._8_4_;
                auVar218._12_4_ = (int)auVar136._12_4_;
                auVar136 = vpslld_avx(auVar218,0x17);
                auVar136 = vpaddd_avx(auVar136,auVar203);
                auVar69._0_4_ =
                     (fVar46 * fVar46 *
                      (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                        0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) + fVar46 + 1.0) *
                     auVar136._0_4_ + 1.0;
                auVar69._4_4_ =
                     (fVar60 * fVar60 *
                      (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) * fVar60 +
                        0.041665796) * fVar60 + 0.16666666) * fVar60 + 0.5) + fVar60 + 1.0) *
                     auVar136._4_4_ + 1.0;
                auVar69._8_4_ =
                     (fVar87 * fVar87 *
                      (((((fVar87 * 0.00019875691 + 0.0013981999) * fVar87 + 0.008333452) * fVar87 +
                        0.041665796) * fVar87 + 0.16666666) * fVar87 + 0.5) + fVar87 + 1.0) *
                     auVar136._8_4_ + 1.0;
                auVar69._12_4_ =
                     (fVar88 * fVar88 *
                      (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 + 0.008333452) * fVar88 +
                        0.041665796) * fVar88 + 0.16666666) * fVar88 + 0.5) + fVar88 + 1.0) *
                     auVar136._12_4_ + 1.0;
                auVar136 = vrcpps_avx(auVar69);
                fVar46 = auVar136._0_4_;
                auVar70._0_4_ = auVar69._0_4_ * fVar46;
                fVar60 = auVar136._4_4_;
                auVar70._4_4_ = auVar69._4_4_ * fVar60;
                fVar87 = auVar136._8_4_;
                auVar70._8_4_ = auVar69._8_4_ * fVar87;
                fVar88 = auVar136._12_4_;
                auVar70._12_4_ = auVar69._12_4_ * fVar88;
                auVar136 = vsubps_avx(auVar203,auVar70);
                auVar67._0_4_ = fVar46 + fVar46 * auVar136._0_4_;
                auVar67._4_4_ = fVar60 + fVar60 * auVar136._4_4_;
                auVar67._8_4_ = fVar87 + fVar87 * auVar136._8_4_;
                auVar67._12_4_ = fVar88 + fVar88 * auVar136._12_4_;
                break;
              case 5:
                auVar191._8_4_ = 0x42b0c0a5;
                auVar191._0_8_ = 0x42b0c0a542b0c0a5;
                auVar191._12_4_ = 0x42b0c0a5;
                auVar136 = vminps_avx(auVar67,auVar191);
                auVar255._8_4_ = 0xc2b0c0a5;
                auVar255._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar255._12_4_ = 0xc2b0c0a5;
                auVar199 = vmaxps_avx(auVar255,auVar136);
                auVar265._0_4_ = auVar199._0_4_ * 1.442695 + 0.5;
                auVar265._4_4_ = auVar199._4_4_ * 1.442695 + 0.5;
                auVar265._8_4_ = auVar199._8_4_ * 1.442695 + 0.5;
                auVar265._12_4_ = auVar199._12_4_ * 1.442695 + 0.5;
                auVar278._0_4_ = (int)auVar265._0_4_;
                auVar278._4_4_ = (int)auVar265._4_4_;
                auVar278._8_4_ = (int)auVar265._8_4_;
                auVar278._12_4_ = (int)auVar265._12_4_;
                auVar208 = vcvtdq2ps_avx(auVar278);
                auVar136 = vcmpps_avx(auVar265,auVar208,1);
                auVar136 = vandps_avx(auVar136,auVar203);
                auVar136 = vsubps_avx(auVar208,auVar136);
                auVar279._0_4_ = auVar136._0_4_ * 0.6931472;
                auVar279._4_4_ = auVar136._4_4_ * 0.6931472;
                auVar279._8_4_ = auVar136._8_4_ * 0.6931472;
                auVar279._12_4_ = auVar136._12_4_ * 0.6931472;
                auVar208 = vsubps_avx(auVar199,auVar279);
                fVar88 = auVar208._0_4_;
                fVar190 = auVar208._4_4_;
                fVar89 = auVar208._8_4_;
                fVar187 = auVar208._12_4_;
                auVar212._0_4_ = (int)auVar136._0_4_;
                auVar212._4_4_ = (int)auVar136._4_4_;
                auVar212._8_4_ = (int)auVar136._8_4_;
                auVar212._12_4_ = (int)auVar136._12_4_;
                auVar136 = vpslld_avx(auVar212,0x17);
                auVar136 = vpaddd_avx(auVar136,auVar203);
                auVar213._0_4_ =
                     (fVar88 + 1.0 +
                     fVar88 * fVar88 *
                     (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 + 0.008333452) * fVar88 +
                       0.041665796) * fVar88 + 0.16666666) * fVar88 + 0.5)) * auVar136._0_4_ + 1.0;
                auVar213._4_4_ =
                     (fVar190 + 1.0 +
                     fVar190 * fVar190 *
                     (((((fVar190 * 0.00019875691 + 0.0013981999) * fVar190 + 0.008333452) * fVar190
                       + 0.041665796) * fVar190 + 0.16666666) * fVar190 + 0.5)) * auVar136._4_4_ +
                     1.0;
                auVar213._8_4_ =
                     (fVar89 + 1.0 +
                     fVar89 * fVar89 *
                     (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                       0.041665796) * fVar89 + 0.16666666) * fVar89 + 0.5)) * auVar136._8_4_ + 1.0;
                auVar213._12_4_ =
                     (fVar187 + 1.0 +
                     fVar187 * fVar187 *
                     (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) * fVar187
                       + 0.041665796) * fVar187 + 0.16666666) * fVar187 + 0.5)) * auVar136._12_4_ +
                     1.0;
                auVar91._8_4_ = 0x800000;
                auVar91._0_8_ = 0x80000000800000;
                auVar91._12_4_ = 0x800000;
                auVar136 = vmaxps_avx(auVar213,auVar91);
                auVar208 = vpsrld_avx(auVar136,0x17);
                auVar141._8_4_ = 0xffffff82;
                auVar141._0_8_ = 0xffffff82ffffff82;
                auVar141._12_4_ = 0xffffff82;
                auVar208 = vpaddd_avx(auVar208,auVar141);
                auVar142._8_4_ = 0x807fffff;
                auVar142._0_8_ = 0x807fffff807fffff;
                auVar142._12_4_ = 0x807fffff;
                auVar136 = vandps_avx(auVar136,auVar142);
                auVar254 = vorps_avx(auVar136,auVar202);
                auVar199 = vcvtdq2ps_avx(auVar208);
                auVar143._8_4_ = 0x3f3504f3;
                auVar143._0_8_ = 0x3f3504f33f3504f3;
                auVar143._12_4_ = 0x3f3504f3;
                auVar208 = vcmpps_avx(auVar254,auVar143,1);
                auVar136 = vandps_avx(auVar208,auVar254);
                fVar88 = auVar254._0_4_ + -1.0 + auVar136._0_4_;
                fVar190 = auVar254._4_4_ + -1.0 + auVar136._4_4_;
                fVar89 = auVar254._8_4_ + -1.0 + auVar136._8_4_;
                fVar187 = auVar254._12_4_ + -1.0 + auVar136._12_4_;
                auVar136 = vandps_avx(auVar208,auVar203);
                auVar208 = vsubps_avx(auVar199,auVar136);
                auVar136 = vcmpps_avx(auVar213,_DAT_0031fce0,2);
                auVar92._0_4_ =
                     (fVar88 * fVar88 *
                      (((((((((fVar88 * 0.070376836 + -0.1151461) * fVar88 + 0.116769984) * fVar88 +
                            -0.12420141) * fVar88 + 0.14249323) * fVar88 + -0.16668057) * fVar88 +
                         0.20000714) * fVar88 + -0.24999994) * fVar88 + 0.3333333) * fVar88 + -0.5)
                     + auVar208._0_4_ * 0.6931472 + fVar88) * -2.0;
                auVar92._4_4_ =
                     (fVar190 * fVar190 *
                      (((((((((fVar190 * 0.070376836 + -0.1151461) * fVar190 + 0.116769984) *
                             fVar190 + -0.12420141) * fVar190 + 0.14249323) * fVar190 + -0.16668057)
                          * fVar190 + 0.20000714) * fVar190 + -0.24999994) * fVar190 + 0.3333333) *
                       fVar190 + -0.5) + auVar208._4_4_ * 0.6931472 + fVar190) * -2.0;
                auVar92._8_4_ =
                     (fVar89 * fVar89 *
                      (((((((((fVar89 * 0.070376836 + -0.1151461) * fVar89 + 0.116769984) * fVar89 +
                            -0.12420141) * fVar89 + 0.14249323) * fVar89 + -0.16668057) * fVar89 +
                         0.20000714) * fVar89 + -0.24999994) * fVar89 + 0.3333333) * fVar89 + -0.5)
                     + auVar208._8_4_ * 0.6931472 + fVar89) * -2.0;
                auVar92._12_4_ =
                     (fVar187 * fVar187 *
                      (((((((((fVar187 * 0.070376836 + -0.1151461) * fVar187 + 0.116769984) *
                             fVar187 + -0.12420141) * fVar187 + 0.14249323) * fVar187 + -0.16668057)
                          * fVar187 + 0.20000714) * fVar187 + -0.24999994) * fVar187 + 0.3333333) *
                       fVar187 + -0.5) + auVar208._12_4_ * 0.6931472 + fVar187) * -2.0;
                auVar144._8_4_ = 0x7fffffff;
                auVar144._0_8_ = 0x7fffffff7fffffff;
                auVar144._12_4_ = 0x7fffffff;
                auVar136 = vblendvps_avx(auVar92,auVar144,auVar136);
                auVar145._8_4_ = 0x42b0c0a5;
                auVar145._0_8_ = 0x42b0c0a542b0c0a5;
                auVar145._12_4_ = 0x42b0c0a5;
                auVar136 = vminps_avx(auVar136,auVar145);
                auVar146._8_4_ = 0xc2b0c0a5;
                auVar146._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar146._12_4_ = 0xc2b0c0a5;
                auVar199 = vmaxps_avx(auVar136,auVar146);
                auVar147._0_4_ = auVar199._0_4_ * 1.442695 + 0.5;
                auVar147._4_4_ = auVar199._4_4_ * 1.442695 + 0.5;
                auVar147._8_4_ = auVar199._8_4_ * 1.442695 + 0.5;
                auVar147._12_4_ = auVar199._12_4_ * 1.442695 + 0.5;
                auVar214._0_4_ = (int)auVar147._0_4_;
                auVar214._4_4_ = (int)auVar147._4_4_;
                auVar214._8_4_ = (int)auVar147._8_4_;
                auVar214._12_4_ = (int)auVar147._12_4_;
                auVar208 = vcvtdq2ps_avx(auVar214);
                auVar136 = vcmpps_avx(auVar147,auVar208,1);
                auVar136 = vandps_avx(auVar136,auVar203);
                auVar136 = vsubps_avx(auVar208,auVar136);
                auVar215._0_4_ = auVar136._0_4_ * 0.6931472;
                auVar215._4_4_ = auVar136._4_4_ * 0.6931472;
                auVar215._8_4_ = auVar136._8_4_ * 0.6931472;
                auVar215._12_4_ = auVar136._12_4_ * 0.6931472;
                auVar208 = vsubps_avx(auVar199,auVar215);
                fVar88 = auVar208._0_4_;
                fVar190 = auVar208._4_4_;
                fVar89 = auVar208._8_4_;
                fVar187 = auVar208._12_4_;
                auVar86 = ZEXT864(0) << 0x20;
                auVar148._0_4_ = (int)auVar136._0_4_;
                auVar148._4_4_ = (int)auVar136._4_4_;
                auVar148._8_4_ = (int)auVar136._8_4_;
                auVar148._12_4_ = (int)auVar136._12_4_;
                auVar136 = vpslld_avx(auVar148,0x17);
                auVar136 = vpaddd_avx(auVar136,auVar203);
                auVar93._0_4_ =
                     (fVar88 + 1.0 +
                     (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 + 0.008333452) * fVar88 +
                       0.041665796) * fVar88 + 0.16666666) * fVar88 + 0.5) * fVar88 * fVar88) *
                     auVar136._0_4_ + 1.0;
                auVar93._4_4_ =
                     (fVar190 + 1.0 +
                     (((((fVar190 * 0.00019875691 + 0.0013981999) * fVar190 + 0.008333452) * fVar190
                       + 0.041665796) * fVar190 + 0.16666666) * fVar190 + 0.5) * fVar190 * fVar190)
                     * auVar136._4_4_ + 1.0;
                auVar93._8_4_ =
                     (fVar89 + 1.0 +
                     (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                       0.041665796) * fVar89 + 0.16666666) * fVar89 + 0.5) * fVar89 * fVar89) *
                     auVar136._8_4_ + 1.0;
                auVar93._12_4_ =
                     (fVar187 + 1.0 +
                     (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) * fVar187
                       + 0.041665796) * fVar187 + 0.16666666) * fVar187 + 0.5) * fVar187 * fVar187)
                     * auVar136._12_4_ + 1.0;
                auVar136 = vrcpps_avx(auVar93);
                fVar88 = auVar136._0_4_;
                fVar190 = auVar136._4_4_;
                fVar89 = auVar136._8_4_;
                fVar187 = auVar136._12_4_;
                auVar94._0_4_ = auVar93._0_4_ * (fVar88 + fVar88);
                auVar94._4_4_ = auVar93._4_4_ * (fVar190 + fVar190);
                auVar94._8_4_ = auVar93._8_4_ * (fVar89 + fVar89);
                auVar94._12_4_ = auVar93._12_4_ * (fVar187 + fVar187);
                auVar192._8_4_ = 0x40000000;
                auVar192._0_8_ = 0x4000000040000000;
                auVar192._12_4_ = 0x40000000;
                auVar136 = vsubps_avx(auVar192,auVar94);
                auVar95._0_4_ = fVar88 + fVar88 + -1.0 + fVar88 * auVar136._0_4_;
                auVar95._4_4_ = fVar190 + fVar190 + -1.0 + fVar190 * auVar136._4_4_;
                auVar95._8_4_ = fVar89 + fVar89 + -1.0 + fVar89 * auVar136._8_4_;
                auVar95._12_4_ = fVar187 + fVar187 + -1.0 + fVar187 * auVar136._12_4_;
                goto LAB_0031456f;
              case 6:
                fVar88 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar190 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar98._0_4_ = fVar88 * auVar67._0_4_ + fVar190;
                auVar98._4_4_ = fVar88 * fVar46 + fVar190;
                auVar98._8_4_ = fVar88 * fVar60 + fVar190;
                auVar98._12_4_ = fVar88 * fVar87 + fVar190;
                auVar136 = vmaxps_avx(auVar136,auVar98);
                auVar95 = vminps_avx(auVar136,auVar203);
LAB_0031456f:
                auVar67._0_4_ = auVar95._0_4_ * auVar67._0_4_;
                auVar67._4_4_ = auVar95._4_4_ * fVar46;
                auVar67._8_4_ = auVar95._8_4_ * fVar60;
                auVar67._12_4_ = auVar95._12_4_ * fVar87;
              }
              *pauVar37 = auVar67;
              pauVar37 = pauVar37 + 1;
              iVar40 = iVar40 + 8;
              bVar45 = iVar42 != iVar3;
              iVar42 = iVar42 + 1;
            } while (bVar45);
          }
          local_110 = local_110 + 1;
        } while (local_110 != _h);
      }
      if ((uVar2 == 4 && uVar33 == 0) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_110 = 0;
        auVar86 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar204._8_4_ = 0x3f800000;
        auVar204._0_8_ = 0x3f8000003f800000;
        auVar204._12_4_ = 0x3f800000;
        do {
          if (-1 < iVar3) {
            pauVar37 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_110 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar40 = 0;
            iVar42 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar71 = ZEXT816(0) << 0x40;
              }
              else {
                auVar71 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var4) + local_110 * 0x10);
              }
              auVar264 = ZEXT1664(auVar71);
              if (0 < iVar27) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * local_110 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                pfVar35 = (float *)((long)&((Allocator *)((long)local_b8.data + 8))->_vptr_Allocator
                                   + (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar40) * 4
                                     + 4);
                uVar39 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar31 = pfVar35;
                    iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      fVar46 = pfVar31[-3];
                      fVar60 = pfVar31[-2];
                      fVar87 = pfVar31[-1];
                      fVar88 = *pfVar31;
                      auVar264 = ZEXT1664(CONCAT412(fVar46 * pfVar43[3] + auVar264._12_4_ +
                                                    fVar60 * pfVar43[7] + fVar87 * pfVar43[0xb] +
                                                    fVar88 * pfVar43[0xf],
                                                    CONCAT48(fVar46 * pfVar43[2] + auVar264._8_4_ +
                                                             fVar60 * pfVar43[6] +
                                                             fVar87 * pfVar43[10] +
                                                             fVar88 * pfVar43[0xe],
                                                             CONCAT44(fVar46 * pfVar43[1] +
                                                                      auVar264._4_4_ +
                                                                      fVar60 * pfVar43[5] +
                                                                      fVar87 * pfVar43[9] +
                                                                      fVar88 * pfVar43[0xd],
                                                                      fVar46 * *pfVar43 +
                                                                      auVar264._0_4_ +
                                                                      fVar60 * pfVar43[4] +
                                                                      fVar87 * pfVar43[8] +
                                                                      fVar88 * pfVar43[0xc]))));
                      pfVar43 = pfVar43 + 0x10;
                      pfVar31 = pfVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 2);
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  auVar71 = auVar264._0_16_;
                  uVar39 = uVar39 + 1;
                  pfVar35 = (float *)((long)pfVar35 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar39 != uVar41);
              }
              p_Var4 = pp_Var5[-3];
              fVar46 = auVar86._0_4_;
              fVar60 = auVar86._4_4_;
              fVar87 = auVar86._8_4_;
              fVar88 = auVar86._12_4_;
              fVar190 = auVar71._4_4_;
              fVar89 = auVar71._8_4_;
              fVar187 = auVar71._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar71 = vmaxps_avx(auVar71,_DAT_0031fce0);
                break;
              case 2:
                auVar136 = vmaxps_avx(auVar71,ZEXT816(0) << 0x40);
                auVar208 = vminps_avx(auVar71,ZEXT816(0) << 0x40);
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar71._0_4_ = fVar46 * auVar208._0_4_ + auVar136._0_4_;
                auVar71._4_4_ = fVar46 * auVar208._4_4_ + auVar136._4_4_;
                auVar71._8_4_ = fVar46 * auVar208._8_4_ + auVar136._8_4_;
                auVar71._12_4_ = fVar46 * auVar208._12_4_ + auVar136._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar223._4_4_ = uVar1;
                auVar223._0_4_ = uVar1;
                auVar223._8_4_ = uVar1;
                auVar223._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar284._4_4_ = uVar1;
                auVar284._0_4_ = uVar1;
                auVar284._8_4_ = uVar1;
                auVar284._12_4_ = uVar1;
                auVar136 = vmaxps_avx(auVar71,auVar223);
                auVar71 = vminps_avx(auVar284,auVar136);
                break;
              case 4:
                auVar72._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
                auVar72._8_4_ = -fVar89;
                auVar72._12_4_ = -fVar187;
                auVar104._8_4_ = 0x42b0c0a5;
                auVar104._0_8_ = 0x42b0c0a542b0c0a5;
                auVar104._12_4_ = 0x42b0c0a5;
                auVar136 = vminps_avx(auVar72,auVar104);
                auVar105._8_4_ = 0xc2b0c0a5;
                auVar105._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar105._12_4_ = 0xc2b0c0a5;
                auVar199 = vmaxps_avx(auVar136,auVar105);
                auVar224._0_4_ = fVar46 + auVar199._0_4_ * 1.442695;
                auVar224._4_4_ = fVar60 + auVar199._4_4_ * 1.442695;
                auVar224._8_4_ = fVar87 + auVar199._8_4_ * 1.442695;
                auVar224._12_4_ = fVar88 + auVar199._12_4_ * 1.442695;
                auVar285._0_4_ = (int)auVar224._0_4_;
                auVar285._4_4_ = (int)auVar224._4_4_;
                auVar285._8_4_ = (int)auVar224._8_4_;
                auVar285._12_4_ = (int)auVar224._12_4_;
                auVar208 = vcvtdq2ps_avx(auVar285);
                auVar136 = vcmpps_avx(auVar224,auVar208,1);
                auVar136 = vandps_avx(auVar136,auVar204);
                auVar136 = vsubps_avx(auVar208,auVar136);
                fVar190 = auVar136._0_4_ * -0.6931472 + auVar199._0_4_;
                fVar89 = auVar136._4_4_ * -0.6931472 + auVar199._4_4_;
                fVar187 = auVar136._8_4_ * -0.6931472 + auVar199._8_4_;
                fVar189 = auVar136._12_4_ * -0.6931472 + auVar199._12_4_;
                auVar225._0_4_ = (int)auVar136._0_4_;
                auVar225._4_4_ = (int)auVar136._4_4_;
                auVar225._8_4_ = (int)auVar136._8_4_;
                auVar225._12_4_ = (int)auVar136._12_4_;
                auVar136 = vpslld_avx(auVar225,0x17);
                auVar136 = vpaddd_avx(auVar136,auVar204);
                auVar73._0_4_ =
                     (fVar190 * fVar190 *
                      (((((fVar190 * 0.00019875691 + 0.0013981999) * fVar190 + 0.008333452) *
                         fVar190 + 0.041665796) * fVar190 + 0.16666666) * fVar190 + fVar46) +
                     fVar190 + 1.0) * auVar136._0_4_ + 1.0;
                auVar73._4_4_ =
                     (fVar89 * fVar89 *
                      (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                        0.041665796) * fVar89 + 0.16666666) * fVar89 + fVar60) + fVar89 + 1.0) *
                     auVar136._4_4_ + 1.0;
                auVar73._8_4_ =
                     (fVar187 * fVar187 *
                      (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) *
                         fVar187 + 0.041665796) * fVar187 + 0.16666666) * fVar187 + fVar87) +
                     fVar187 + 1.0) * auVar136._8_4_ + 1.0;
                auVar73._12_4_ =
                     (fVar189 * fVar189 *
                      (((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) *
                         fVar189 + 0.041665796) * fVar189 + 0.16666666) * fVar189 + fVar88) +
                     fVar189 + 1.0) * auVar136._12_4_ + 1.0;
                auVar136 = vrcpps_avx(auVar73);
                fVar46 = auVar136._0_4_;
                auVar74._0_4_ = auVar73._0_4_ * fVar46;
                fVar60 = auVar136._4_4_;
                auVar74._4_4_ = auVar73._4_4_ * fVar60;
                fVar87 = auVar136._8_4_;
                auVar74._8_4_ = auVar73._8_4_ * fVar87;
                fVar88 = auVar136._12_4_;
                auVar74._12_4_ = auVar73._12_4_ * fVar88;
                auVar136 = vsubps_avx(auVar204,auVar74);
                auVar71._0_4_ = fVar46 + fVar46 * auVar136._0_4_;
                auVar71._4_4_ = fVar60 + fVar60 * auVar136._4_4_;
                auVar71._8_4_ = fVar87 + fVar87 * auVar136._8_4_;
                auVar71._12_4_ = fVar88 + fVar88 * auVar136._12_4_;
                break;
              case 5:
                auVar193._8_4_ = 0x42b0c0a5;
                auVar193._0_8_ = 0x42b0c0a542b0c0a5;
                auVar193._12_4_ = 0x42b0c0a5;
                auVar136 = vminps_avx(auVar71,auVar193);
                auVar256._8_4_ = 0xc2b0c0a5;
                auVar256._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar256._12_4_ = 0xc2b0c0a5;
                auVar199 = vmaxps_avx(auVar256,auVar136);
                auVar266._0_4_ = auVar199._0_4_ * 1.442695 + fVar46;
                auVar266._4_4_ = auVar199._4_4_ * 1.442695 + fVar60;
                auVar266._8_4_ = auVar199._8_4_ * 1.442695 + fVar87;
                auVar266._12_4_ = auVar199._12_4_ * 1.442695 + fVar88;
                auVar282._0_4_ = (int)auVar266._0_4_;
                auVar282._4_4_ = (int)auVar266._4_4_;
                auVar282._8_4_ = (int)auVar266._8_4_;
                auVar282._12_4_ = (int)auVar266._12_4_;
                auVar208 = vcvtdq2ps_avx(auVar282);
                auVar136 = vcmpps_avx(auVar266,auVar208,1);
                auVar136 = vandps_avx(auVar136,auVar204);
                auVar136 = vsubps_avx(auVar208,auVar136);
                auVar283._0_4_ = auVar136._0_4_ * 0.6931472;
                auVar283._4_4_ = auVar136._4_4_ * 0.6931472;
                auVar283._8_4_ = auVar136._8_4_ * 0.6931472;
                auVar283._12_4_ = auVar136._12_4_ * 0.6931472;
                auVar208 = vsubps_avx(auVar199,auVar283);
                fVar189 = auVar208._0_4_;
                fVar135 = auVar208._4_4_;
                fVar182 = auVar208._8_4_;
                fVar183 = auVar208._12_4_;
                auVar219._0_4_ = (int)auVar136._0_4_;
                auVar219._4_4_ = (int)auVar136._4_4_;
                auVar219._8_4_ = (int)auVar136._8_4_;
                auVar219._12_4_ = (int)auVar136._12_4_;
                auVar136 = vpslld_avx(auVar219,0x17);
                auVar136 = vpaddd_avx(auVar136,auVar204);
                auVar220._0_4_ =
                     (fVar189 + 1.0 +
                     fVar189 * fVar189 *
                     (((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) * fVar189
                       + 0.041665796) * fVar189 + 0.16666666) * fVar189 + fVar46)) * auVar136._0_4_
                     + 1.0;
                auVar220._4_4_ =
                     (fVar135 + 1.0 +
                     fVar135 * fVar135 *
                     (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135
                       + 0.041665796) * fVar135 + 0.16666666) * fVar135 + fVar60)) * auVar136._4_4_
                     + 1.0;
                auVar220._8_4_ =
                     (fVar182 + 1.0 +
                     fVar182 * fVar182 *
                     (((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182
                       + 0.041665796) * fVar182 + 0.16666666) * fVar182 + fVar87)) * auVar136._8_4_
                     + 1.0;
                auVar220._12_4_ =
                     (fVar183 + 1.0 +
                     fVar183 * fVar183 *
                     (((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452) * fVar183
                       + 0.041665796) * fVar183 + 0.16666666) * fVar183 + fVar88)) * auVar136._12_4_
                     + 1.0;
                auVar99._8_4_ = 0x800000;
                auVar99._0_8_ = 0x80000000800000;
                auVar99._12_4_ = 0x800000;
                auVar136 = vmaxps_avx(auVar220,auVar99);
                auVar208 = vpsrld_avx(auVar136,0x17);
                auVar149._8_4_ = 0xffffff82;
                auVar149._0_8_ = 0xffffff82ffffff82;
                auVar149._12_4_ = 0xffffff82;
                auVar208 = vpaddd_avx(auVar208,auVar149);
                auVar150._8_4_ = 0x807fffff;
                auVar150._0_8_ = 0x807fffff807fffff;
                auVar150._12_4_ = 0x807fffff;
                auVar136 = vandps_avx(auVar136,auVar150);
                auVar254 = vorps_avx(auVar136,auVar86._0_16_);
                auVar199 = vcvtdq2ps_avx(auVar208);
                auVar151._8_4_ = 0x3f3504f3;
                auVar151._0_8_ = 0x3f3504f33f3504f3;
                auVar151._12_4_ = 0x3f3504f3;
                auVar208 = vcmpps_avx(auVar254,auVar151,1);
                auVar136 = vandps_avx(auVar208,auVar254);
                fVar189 = auVar254._0_4_ + -1.0 + auVar136._0_4_;
                fVar135 = auVar254._4_4_ + -1.0 + auVar136._4_4_;
                fVar182 = auVar254._8_4_ + -1.0 + auVar136._8_4_;
                fVar183 = auVar254._12_4_ + -1.0 + auVar136._12_4_;
                auVar136 = vandps_avx(auVar208,auVar204);
                auVar208 = vsubps_avx(auVar199,auVar136);
                auVar136 = vcmpps_avx(auVar220,_DAT_0031fce0,2);
                auVar100._0_4_ =
                     (fVar189 * fVar189 *
                      (((((((((fVar189 * 0.070376836 + -0.1151461) * fVar189 + 0.116769984) *
                             fVar189 + -0.12420141) * fVar189 + 0.14249323) * fVar189 + -0.16668057)
                          * fVar189 + 0.20000714) * fVar189 + -0.24999994) * fVar189 + 0.3333333) *
                       fVar189 + -0.5) + auVar208._0_4_ * 0.6931472 + fVar189) * -2.0;
                auVar100._4_4_ =
                     (fVar135 * fVar135 *
                      (((((((((fVar135 * 0.070376836 + -0.1151461) * fVar135 + 0.116769984) *
                             fVar135 + -0.12420141) * fVar135 + 0.14249323) * fVar135 + -0.16668057)
                          * fVar135 + 0.20000714) * fVar135 + -0.24999994) * fVar135 + 0.3333333) *
                       fVar135 + -0.5) + auVar208._4_4_ * 0.6931472 + fVar135) * -2.0;
                auVar100._8_4_ =
                     (fVar182 * fVar182 *
                      (((((((((fVar182 * 0.070376836 + -0.1151461) * fVar182 + 0.116769984) *
                             fVar182 + -0.12420141) * fVar182 + 0.14249323) * fVar182 + -0.16668057)
                          * fVar182 + 0.20000714) * fVar182 + -0.24999994) * fVar182 + 0.3333333) *
                       fVar182 + -0.5) + auVar208._8_4_ * 0.6931472 + fVar182) * -2.0;
                auVar100._12_4_ =
                     (fVar183 * fVar183 *
                      (((((((((fVar183 * 0.070376836 + -0.1151461) * fVar183 + 0.116769984) *
                             fVar183 + -0.12420141) * fVar183 + 0.14249323) * fVar183 + -0.16668057)
                          * fVar183 + 0.20000714) * fVar183 + -0.24999994) * fVar183 + 0.3333333) *
                       fVar183 + -0.5) + auVar208._12_4_ * 0.6931472 + fVar183) * -2.0;
                auVar152._8_4_ = 0x7fffffff;
                auVar152._0_8_ = 0x7fffffff7fffffff;
                auVar152._12_4_ = 0x7fffffff;
                auVar136 = vblendvps_avx(auVar100,auVar152,auVar136);
                auVar153._8_4_ = 0x42b0c0a5;
                auVar153._0_8_ = 0x42b0c0a542b0c0a5;
                auVar153._12_4_ = 0x42b0c0a5;
                auVar136 = vminps_avx(auVar136,auVar153);
                auVar154._8_4_ = 0xc2b0c0a5;
                auVar154._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar154._12_4_ = 0xc2b0c0a5;
                auVar199 = vmaxps_avx(auVar136,auVar154);
                auVar155._0_4_ = auVar199._0_4_ * 1.442695 + fVar46;
                auVar155._4_4_ = auVar199._4_4_ * 1.442695 + fVar60;
                auVar155._8_4_ = auVar199._8_4_ * 1.442695 + fVar87;
                auVar155._12_4_ = auVar199._12_4_ * 1.442695 + fVar88;
                auVar221._0_4_ = (int)auVar155._0_4_;
                auVar221._4_4_ = (int)auVar155._4_4_;
                auVar221._8_4_ = (int)auVar155._8_4_;
                auVar221._12_4_ = (int)auVar155._12_4_;
                auVar208 = vcvtdq2ps_avx(auVar221);
                auVar136 = vcmpps_avx(auVar155,auVar208,1);
                auVar136 = vandps_avx(auVar136,auVar204);
                auVar136 = vsubps_avx(auVar208,auVar136);
                auVar222._0_4_ = auVar136._0_4_ * 0.6931472;
                auVar222._4_4_ = auVar136._4_4_ * 0.6931472;
                auVar222._8_4_ = auVar136._8_4_ * 0.6931472;
                auVar222._12_4_ = auVar136._12_4_ * 0.6931472;
                auVar208 = vsubps_avx(auVar199,auVar222);
                fVar189 = auVar208._0_4_;
                fVar135 = auVar208._4_4_;
                fVar182 = auVar208._8_4_;
                fVar183 = auVar208._12_4_;
                auVar86 = ZEXT1664(auVar86._0_16_);
                auVar156._0_4_ = (int)auVar136._0_4_;
                auVar156._4_4_ = (int)auVar136._4_4_;
                auVar156._8_4_ = (int)auVar136._8_4_;
                auVar156._12_4_ = (int)auVar136._12_4_;
                auVar136 = vpslld_avx(auVar156,0x17);
                auVar136 = vpaddd_avx(auVar136,auVar204);
                auVar101._0_4_ =
                     (fVar189 + 1.0 +
                     (((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) * fVar189
                       + 0.041665796) * fVar189 + 0.16666666) * fVar189 + fVar46) *
                     fVar189 * fVar189) * auVar136._0_4_ + 1.0;
                auVar101._4_4_ =
                     (fVar135 + 1.0 +
                     (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135
                       + 0.041665796) * fVar135 + 0.16666666) * fVar135 + fVar60) *
                     fVar135 * fVar135) * auVar136._4_4_ + 1.0;
                auVar101._8_4_ =
                     (fVar182 + 1.0 +
                     (((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182
                       + 0.041665796) * fVar182 + 0.16666666) * fVar182 + fVar87) *
                     fVar182 * fVar182) * auVar136._8_4_ + 1.0;
                auVar101._12_4_ =
                     (fVar183 + 1.0 +
                     (((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452) * fVar183
                       + 0.041665796) * fVar183 + 0.16666666) * fVar183 + fVar88) *
                     fVar183 * fVar183) * auVar136._12_4_ + 1.0;
                auVar136 = vrcpps_avx(auVar101);
                fVar46 = auVar136._0_4_;
                fVar60 = auVar136._4_4_;
                fVar87 = auVar136._8_4_;
                fVar88 = auVar136._12_4_;
                auVar102._0_4_ = auVar101._0_4_ * (fVar46 + fVar46);
                auVar102._4_4_ = auVar101._4_4_ * (fVar60 + fVar60);
                auVar102._8_4_ = auVar101._8_4_ * (fVar87 + fVar87);
                auVar102._12_4_ = auVar101._12_4_ * (fVar88 + fVar88);
                auVar194._8_4_ = 0x40000000;
                auVar194._0_8_ = 0x4000000040000000;
                auVar194._12_4_ = 0x40000000;
                auVar136 = vsubps_avx(auVar194,auVar102);
                auVar103._0_4_ = fVar46 + fVar46 + -1.0 + fVar46 * auVar136._0_4_;
                auVar103._4_4_ = fVar60 + fVar60 + -1.0 + fVar60 * auVar136._4_4_;
                auVar103._8_4_ = fVar87 + fVar87 + -1.0 + fVar87 * auVar136._8_4_;
                auVar103._12_4_ = fVar88 + fVar88 + -1.0 + fVar88 * auVar136._12_4_;
                goto LAB_00314b8b;
              case 6:
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar60 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar106._0_4_ = fVar46 * auVar71._0_4_ + fVar60;
                auVar106._4_4_ = fVar46 * fVar190 + fVar60;
                auVar106._8_4_ = fVar46 * fVar89 + fVar60;
                auVar106._12_4_ = fVar46 * fVar187 + fVar60;
                auVar136 = vmaxps_avx(auVar106,_DAT_0031fce0);
                auVar103 = vminps_avx(auVar136,auVar204);
LAB_00314b8b:
                auVar71._0_4_ = auVar103._0_4_ * auVar71._0_4_;
                auVar71._4_4_ = auVar103._4_4_ * fVar190;
                auVar71._8_4_ = auVar103._8_4_ * fVar89;
                auVar71._12_4_ = auVar103._12_4_ * fVar187;
              }
              *pauVar37 = auVar71;
              pauVar37 = pauVar37 + 1;
              iVar40 = iVar40 + 4;
              bVar45 = iVar42 != iVar3;
              iVar42 = iVar42 + 1;
            } while (bVar45);
          }
          local_110 = local_110 + 1;
        } while (local_110 != _h);
      }
      if ((uVar33 == 0 && uVar2 == 1) && 0 < (int)_h) {
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        uVar39 = 0;
        auVar86 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar205._8_4_ = 0x3f800000;
        auVar205._0_8_ = 0x3f8000003f800000;
        auVar205._12_4_ = 0x3f800000;
        do {
          if (-1 < iVar3) {
            pauVar37 = (undefined1 (*) [16])
                       ((long)top_blob->w * uVar39 * top_blob->elemsize + (long)top_blob->data);
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            iVar42 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar75 = ZEXT816(0) << 0x40;
              }
              else {
                auVar75 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var4) + uVar39 * 0x10);
              }
              auVar264 = ZEXT1664(auVar75);
              if (0 < iVar27) {
                pfVar43 = (float *)((this->weight_data_packed).cstep * uVar39 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var4 = pp_Var6[-3];
                pfVar35 = (float *)((long)(_func_int ***)local_b8.data +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar42) * 4);
                uVar34 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar31 = pfVar35;
                    iVar40 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      fVar46 = *pfVar31;
                      auVar264 = ZEXT1664(CONCAT412(fVar46 * pfVar43[3] + auVar264._12_4_,
                                                    CONCAT48(fVar46 * pfVar43[2] + auVar264._8_4_,
                                                             CONCAT44(fVar46 * pfVar43[1] +
                                                                      auVar264._4_4_,
                                                                      fVar46 * *pfVar43 +
                                                                      auVar264._0_4_))));
                      pfVar43 = pfVar43 + 4;
                      pfVar31 = pfVar31 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  auVar75 = auVar264._0_16_;
                  uVar34 = uVar34 + 1;
                  pfVar35 = (float *)((long)pfVar35 + (long)local_b8.w * local_b8.elemsize);
                } while (uVar34 != uVar41);
              }
              p_Var4 = pp_Var5[-3];
              fVar46 = auVar86._0_4_;
              fVar60 = auVar86._4_4_;
              fVar87 = auVar86._8_4_;
              fVar88 = auVar86._12_4_;
              fVar190 = auVar75._4_4_;
              fVar89 = auVar75._8_4_;
              fVar187 = auVar75._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar75 = vmaxps_avx(auVar75,_DAT_0031fce0);
                break;
              case 2:
                auVar136 = vmaxps_avx(auVar75,ZEXT816(0) << 0x40);
                auVar208 = vminps_avx(auVar75,ZEXT816(0) << 0x40);
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                auVar75._0_4_ = fVar46 * auVar208._0_4_ + auVar136._0_4_;
                auVar75._4_4_ = fVar46 * auVar208._4_4_ + auVar136._4_4_;
                auVar75._8_4_ = fVar46 * auVar208._8_4_ + auVar136._8_4_;
                auVar75._12_4_ = fVar46 * auVar208._12_4_ + auVar136._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var4);
                auVar230._4_4_ = uVar1;
                auVar230._0_4_ = uVar1;
                auVar230._8_4_ = uVar1;
                auVar230._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar288._4_4_ = uVar1;
                auVar288._0_4_ = uVar1;
                auVar288._8_4_ = uVar1;
                auVar288._12_4_ = uVar1;
                auVar136 = vmaxps_avx(auVar75,auVar230);
                auVar75 = vminps_avx(auVar288,auVar136);
                break;
              case 4:
                auVar76._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
                auVar76._8_4_ = -fVar89;
                auVar76._12_4_ = -fVar187;
                auVar112._8_4_ = 0x42b0c0a5;
                auVar112._0_8_ = 0x42b0c0a542b0c0a5;
                auVar112._12_4_ = 0x42b0c0a5;
                auVar136 = vminps_avx(auVar76,auVar112);
                auVar113._8_4_ = 0xc2b0c0a5;
                auVar113._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar113._12_4_ = 0xc2b0c0a5;
                auVar199 = vmaxps_avx(auVar136,auVar113);
                auVar231._0_4_ = fVar46 + auVar199._0_4_ * 1.442695;
                auVar231._4_4_ = fVar60 + auVar199._4_4_ * 1.442695;
                auVar231._8_4_ = fVar87 + auVar199._8_4_ * 1.442695;
                auVar231._12_4_ = fVar88 + auVar199._12_4_ * 1.442695;
                auVar289._0_4_ = (int)auVar231._0_4_;
                auVar289._4_4_ = (int)auVar231._4_4_;
                auVar289._8_4_ = (int)auVar231._8_4_;
                auVar289._12_4_ = (int)auVar231._12_4_;
                auVar208 = vcvtdq2ps_avx(auVar289);
                auVar136 = vcmpps_avx(auVar231,auVar208,1);
                auVar136 = vandps_avx(auVar136,auVar205);
                auVar136 = vsubps_avx(auVar208,auVar136);
                fVar190 = auVar136._0_4_ * -0.6931472 + auVar199._0_4_;
                fVar89 = auVar136._4_4_ * -0.6931472 + auVar199._4_4_;
                fVar187 = auVar136._8_4_ * -0.6931472 + auVar199._8_4_;
                fVar189 = auVar136._12_4_ * -0.6931472 + auVar199._12_4_;
                auVar232._0_4_ = (int)auVar136._0_4_;
                auVar232._4_4_ = (int)auVar136._4_4_;
                auVar232._8_4_ = (int)auVar136._8_4_;
                auVar232._12_4_ = (int)auVar136._12_4_;
                auVar136 = vpslld_avx(auVar232,0x17);
                auVar136 = vpaddd_avx(auVar136,auVar205);
                auVar77._0_4_ =
                     (fVar190 * fVar190 *
                      (((((fVar190 * 0.00019875691 + 0.0013981999) * fVar190 + 0.008333452) *
                         fVar190 + 0.041665796) * fVar190 + 0.16666666) * fVar190 + fVar46) +
                     fVar190 + 1.0) * auVar136._0_4_ + 1.0;
                auVar77._4_4_ =
                     (fVar89 * fVar89 *
                      (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                        0.041665796) * fVar89 + 0.16666666) * fVar89 + fVar60) + fVar89 + 1.0) *
                     auVar136._4_4_ + 1.0;
                auVar77._8_4_ =
                     (fVar187 * fVar187 *
                      (((((fVar187 * 0.00019875691 + 0.0013981999) * fVar187 + 0.008333452) *
                         fVar187 + 0.041665796) * fVar187 + 0.16666666) * fVar187 + fVar87) +
                     fVar187 + 1.0) * auVar136._8_4_ + 1.0;
                auVar77._12_4_ =
                     (fVar189 * fVar189 *
                      (((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) *
                         fVar189 + 0.041665796) * fVar189 + 0.16666666) * fVar189 + fVar88) +
                     fVar189 + 1.0) * auVar136._12_4_ + 1.0;
                auVar136 = vrcpps_avx(auVar77);
                fVar46 = auVar136._0_4_;
                auVar78._0_4_ = auVar77._0_4_ * fVar46;
                fVar60 = auVar136._4_4_;
                auVar78._4_4_ = auVar77._4_4_ * fVar60;
                fVar87 = auVar136._8_4_;
                auVar78._8_4_ = auVar77._8_4_ * fVar87;
                fVar88 = auVar136._12_4_;
                auVar78._12_4_ = auVar77._12_4_ * fVar88;
                auVar136 = vsubps_avx(auVar205,auVar78);
                auVar75._0_4_ = fVar46 + fVar46 * auVar136._0_4_;
                auVar75._4_4_ = fVar60 + fVar60 * auVar136._4_4_;
                auVar75._8_4_ = fVar87 + fVar87 * auVar136._8_4_;
                auVar75._12_4_ = fVar88 + fVar88 * auVar136._12_4_;
                break;
              case 5:
                auVar195._8_4_ = 0x42b0c0a5;
                auVar195._0_8_ = 0x42b0c0a542b0c0a5;
                auVar195._12_4_ = 0x42b0c0a5;
                auVar136 = vminps_avx(auVar75,auVar195);
                auVar257._8_4_ = 0xc2b0c0a5;
                auVar257._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar257._12_4_ = 0xc2b0c0a5;
                auVar199 = vmaxps_avx(auVar257,auVar136);
                auVar267._0_4_ = auVar199._0_4_ * 1.442695 + fVar46;
                auVar267._4_4_ = auVar199._4_4_ * 1.442695 + fVar60;
                auVar267._8_4_ = auVar199._8_4_ * 1.442695 + fVar87;
                auVar267._12_4_ = auVar199._12_4_ * 1.442695 + fVar88;
                auVar286._0_4_ = (int)auVar267._0_4_;
                auVar286._4_4_ = (int)auVar267._4_4_;
                auVar286._8_4_ = (int)auVar267._8_4_;
                auVar286._12_4_ = (int)auVar267._12_4_;
                auVar208 = vcvtdq2ps_avx(auVar286);
                auVar136 = vcmpps_avx(auVar267,auVar208,1);
                auVar136 = vandps_avx(auVar136,auVar205);
                auVar136 = vsubps_avx(auVar208,auVar136);
                auVar287._0_4_ = auVar136._0_4_ * 0.6931472;
                auVar287._4_4_ = auVar136._4_4_ * 0.6931472;
                auVar287._8_4_ = auVar136._8_4_ * 0.6931472;
                auVar287._12_4_ = auVar136._12_4_ * 0.6931472;
                auVar208 = vsubps_avx(auVar199,auVar287);
                fVar189 = auVar208._0_4_;
                fVar135 = auVar208._4_4_;
                fVar182 = auVar208._8_4_;
                fVar183 = auVar208._12_4_;
                auVar226._0_4_ = (int)auVar136._0_4_;
                auVar226._4_4_ = (int)auVar136._4_4_;
                auVar226._8_4_ = (int)auVar136._8_4_;
                auVar226._12_4_ = (int)auVar136._12_4_;
                auVar136 = vpslld_avx(auVar226,0x17);
                auVar136 = vpaddd_avx(auVar136,auVar205);
                auVar227._0_4_ =
                     (fVar189 + 1.0 +
                     fVar189 * fVar189 *
                     (((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) * fVar189
                       + 0.041665796) * fVar189 + 0.16666666) * fVar189 + fVar46)) * auVar136._0_4_
                     + 1.0;
                auVar227._4_4_ =
                     (fVar135 + 1.0 +
                     fVar135 * fVar135 *
                     (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135
                       + 0.041665796) * fVar135 + 0.16666666) * fVar135 + fVar60)) * auVar136._4_4_
                     + 1.0;
                auVar227._8_4_ =
                     (fVar182 + 1.0 +
                     fVar182 * fVar182 *
                     (((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182
                       + 0.041665796) * fVar182 + 0.16666666) * fVar182 + fVar87)) * auVar136._8_4_
                     + 1.0;
                auVar227._12_4_ =
                     (fVar183 + 1.0 +
                     fVar183 * fVar183 *
                     (((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452) * fVar183
                       + 0.041665796) * fVar183 + 0.16666666) * fVar183 + fVar88)) * auVar136._12_4_
                     + 1.0;
                auVar107._8_4_ = 0x800000;
                auVar107._0_8_ = 0x80000000800000;
                auVar107._12_4_ = 0x800000;
                auVar136 = vmaxps_avx(auVar227,auVar107);
                auVar208 = vpsrld_avx(auVar136,0x17);
                auVar157._8_4_ = 0xffffff82;
                auVar157._0_8_ = 0xffffff82ffffff82;
                auVar157._12_4_ = 0xffffff82;
                auVar208 = vpaddd_avx(auVar208,auVar157);
                auVar158._8_4_ = 0x807fffff;
                auVar158._0_8_ = 0x807fffff807fffff;
                auVar158._12_4_ = 0x807fffff;
                auVar136 = vandps_avx(auVar136,auVar158);
                auVar254 = vorps_avx(auVar136,auVar86._0_16_);
                auVar199 = vcvtdq2ps_avx(auVar208);
                auVar159._8_4_ = 0x3f3504f3;
                auVar159._0_8_ = 0x3f3504f33f3504f3;
                auVar159._12_4_ = 0x3f3504f3;
                auVar208 = vcmpps_avx(auVar254,auVar159,1);
                auVar136 = vandps_avx(auVar208,auVar254);
                fVar189 = auVar254._0_4_ + -1.0 + auVar136._0_4_;
                fVar135 = auVar254._4_4_ + -1.0 + auVar136._4_4_;
                fVar182 = auVar254._8_4_ + -1.0 + auVar136._8_4_;
                fVar183 = auVar254._12_4_ + -1.0 + auVar136._12_4_;
                auVar136 = vandps_avx(auVar208,auVar205);
                auVar208 = vsubps_avx(auVar199,auVar136);
                auVar136 = vcmpps_avx(auVar227,_DAT_0031fce0,2);
                auVar108._0_4_ =
                     (fVar189 * fVar189 *
                      (((((((((fVar189 * 0.070376836 + -0.1151461) * fVar189 + 0.116769984) *
                             fVar189 + -0.12420141) * fVar189 + 0.14249323) * fVar189 + -0.16668057)
                          * fVar189 + 0.20000714) * fVar189 + -0.24999994) * fVar189 + 0.3333333) *
                       fVar189 + -0.5) + auVar208._0_4_ * 0.6931472 + fVar189) * -2.0;
                auVar108._4_4_ =
                     (fVar135 * fVar135 *
                      (((((((((fVar135 * 0.070376836 + -0.1151461) * fVar135 + 0.116769984) *
                             fVar135 + -0.12420141) * fVar135 + 0.14249323) * fVar135 + -0.16668057)
                          * fVar135 + 0.20000714) * fVar135 + -0.24999994) * fVar135 + 0.3333333) *
                       fVar135 + -0.5) + auVar208._4_4_ * 0.6931472 + fVar135) * -2.0;
                auVar108._8_4_ =
                     (fVar182 * fVar182 *
                      (((((((((fVar182 * 0.070376836 + -0.1151461) * fVar182 + 0.116769984) *
                             fVar182 + -0.12420141) * fVar182 + 0.14249323) * fVar182 + -0.16668057)
                          * fVar182 + 0.20000714) * fVar182 + -0.24999994) * fVar182 + 0.3333333) *
                       fVar182 + -0.5) + auVar208._8_4_ * 0.6931472 + fVar182) * -2.0;
                auVar108._12_4_ =
                     (fVar183 * fVar183 *
                      (((((((((fVar183 * 0.070376836 + -0.1151461) * fVar183 + 0.116769984) *
                             fVar183 + -0.12420141) * fVar183 + 0.14249323) * fVar183 + -0.16668057)
                          * fVar183 + 0.20000714) * fVar183 + -0.24999994) * fVar183 + 0.3333333) *
                       fVar183 + -0.5) + auVar208._12_4_ * 0.6931472 + fVar183) * -2.0;
                auVar160._8_4_ = 0x7fffffff;
                auVar160._0_8_ = 0x7fffffff7fffffff;
                auVar160._12_4_ = 0x7fffffff;
                auVar136 = vblendvps_avx(auVar108,auVar160,auVar136);
                auVar161._8_4_ = 0x42b0c0a5;
                auVar161._0_8_ = 0x42b0c0a542b0c0a5;
                auVar161._12_4_ = 0x42b0c0a5;
                auVar136 = vminps_avx(auVar136,auVar161);
                auVar162._8_4_ = 0xc2b0c0a5;
                auVar162._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar162._12_4_ = 0xc2b0c0a5;
                auVar199 = vmaxps_avx(auVar136,auVar162);
                auVar163._0_4_ = auVar199._0_4_ * 1.442695 + fVar46;
                auVar163._4_4_ = auVar199._4_4_ * 1.442695 + fVar60;
                auVar163._8_4_ = auVar199._8_4_ * 1.442695 + fVar87;
                auVar163._12_4_ = auVar199._12_4_ * 1.442695 + fVar88;
                auVar228._0_4_ = (int)auVar163._0_4_;
                auVar228._4_4_ = (int)auVar163._4_4_;
                auVar228._8_4_ = (int)auVar163._8_4_;
                auVar228._12_4_ = (int)auVar163._12_4_;
                auVar208 = vcvtdq2ps_avx(auVar228);
                auVar136 = vcmpps_avx(auVar163,auVar208,1);
                auVar136 = vandps_avx(auVar136,auVar205);
                auVar136 = vsubps_avx(auVar208,auVar136);
                auVar229._0_4_ = auVar136._0_4_ * 0.6931472;
                auVar229._4_4_ = auVar136._4_4_ * 0.6931472;
                auVar229._8_4_ = auVar136._8_4_ * 0.6931472;
                auVar229._12_4_ = auVar136._12_4_ * 0.6931472;
                auVar208 = vsubps_avx(auVar199,auVar229);
                fVar189 = auVar208._0_4_;
                fVar135 = auVar208._4_4_;
                fVar182 = auVar208._8_4_;
                fVar183 = auVar208._12_4_;
                auVar86 = ZEXT1664(auVar86._0_16_);
                auVar164._0_4_ = (int)auVar136._0_4_;
                auVar164._4_4_ = (int)auVar136._4_4_;
                auVar164._8_4_ = (int)auVar136._8_4_;
                auVar164._12_4_ = (int)auVar136._12_4_;
                auVar136 = vpslld_avx(auVar164,0x17);
                auVar136 = vpaddd_avx(auVar136,auVar205);
                auVar109._0_4_ =
                     (fVar189 + 1.0 +
                     (((((fVar189 * 0.00019875691 + 0.0013981999) * fVar189 + 0.008333452) * fVar189
                       + 0.041665796) * fVar189 + 0.16666666) * fVar189 + fVar46) *
                     fVar189 * fVar189) * auVar136._0_4_ + 1.0;
                auVar109._4_4_ =
                     (fVar135 + 1.0 +
                     (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135
                       + 0.041665796) * fVar135 + 0.16666666) * fVar135 + fVar60) *
                     fVar135 * fVar135) * auVar136._4_4_ + 1.0;
                auVar109._8_4_ =
                     (fVar182 + 1.0 +
                     (((((fVar182 * 0.00019875691 + 0.0013981999) * fVar182 + 0.008333452) * fVar182
                       + 0.041665796) * fVar182 + 0.16666666) * fVar182 + fVar87) *
                     fVar182 * fVar182) * auVar136._8_4_ + 1.0;
                auVar109._12_4_ =
                     (fVar183 + 1.0 +
                     (((((fVar183 * 0.00019875691 + 0.0013981999) * fVar183 + 0.008333452) * fVar183
                       + 0.041665796) * fVar183 + 0.16666666) * fVar183 + fVar88) *
                     fVar183 * fVar183) * auVar136._12_4_ + 1.0;
                auVar136 = vrcpps_avx(auVar109);
                fVar46 = auVar136._0_4_;
                fVar60 = auVar136._4_4_;
                fVar87 = auVar136._8_4_;
                fVar88 = auVar136._12_4_;
                auVar110._0_4_ = auVar109._0_4_ * (fVar46 + fVar46);
                auVar110._4_4_ = auVar109._4_4_ * (fVar60 + fVar60);
                auVar110._8_4_ = auVar109._8_4_ * (fVar87 + fVar87);
                auVar110._12_4_ = auVar109._12_4_ * (fVar88 + fVar88);
                auVar196._8_4_ = 0x40000000;
                auVar196._0_8_ = 0x4000000040000000;
                auVar196._12_4_ = 0x40000000;
                auVar136 = vsubps_avx(auVar196,auVar110);
                auVar111._0_4_ = fVar46 + fVar46 + -1.0 + fVar46 * auVar136._0_4_;
                auVar111._4_4_ = fVar60 + fVar60 + -1.0 + fVar60 * auVar136._4_4_;
                auVar111._8_4_ = fVar87 + fVar87 + -1.0 + fVar87 * auVar136._8_4_;
                auVar111._12_4_ = fVar88 + fVar88 + -1.0 + fVar88 * auVar136._12_4_;
                goto LAB_0031515f;
              case 6:
                fVar46 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar60 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                auVar114._0_4_ = fVar46 * auVar75._0_4_ + fVar60;
                auVar114._4_4_ = fVar46 * fVar190 + fVar60;
                auVar114._8_4_ = fVar46 * fVar89 + fVar60;
                auVar114._12_4_ = fVar46 * fVar187 + fVar60;
                auVar136 = vmaxps_avx(auVar114,_DAT_0031fce0);
                auVar111 = vminps_avx(auVar136,auVar205);
LAB_0031515f:
                auVar75._0_4_ = auVar111._0_4_ * auVar75._0_4_;
                auVar75._4_4_ = auVar111._4_4_ * fVar190;
                auVar75._8_4_ = auVar111._8_4_ * fVar89;
                auVar75._12_4_ = auVar111._12_4_ * fVar187;
              }
              *pauVar37 = auVar75;
              pauVar37 = pauVar37 + 1;
              bVar45 = iVar42 != iVar3;
              iVar42 = iVar42 + 1;
            } while (bVar45);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != _h);
      }
      if ((uVar2 == 4 && uVar30 == 0) && 0 < (int)_h) {
        local_60 = top_blob->data;
        local_68 = (long)top_blob->w * top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        local_58 = (ulong)_h;
        uVar39 = 0;
        do {
          pvVar26 = local_60;
          pvVar10 = local_b8.data;
          if (-1 < iVar3) {
            lVar29 = local_68 * uVar39;
            lVar44 = (long)local_b8.w * local_b8.elemsize;
            pp_Var6 = this->_vptr_Convolution1D_x86_avx;
            sVar7 = (this->weight_data_packed).cstep;
            sVar8 = (this->weight_data_packed).elemsize;
            pvVar9 = (this->weight_data_packed).data;
            iVar42 = 0;
            uVar34 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar86 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar86 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) +
                                           uVar39 * 4));
              }
              auVar136 = auVar86._0_16_;
              if (0 < iVar27) {
                p_Var4 = pp_Var6[-3];
                pfVar35 = (float *)((long)(_func_int ***)pvVar10 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * iVar42) * 4);
                uVar36 = 0;
                pfVar43 = (float *)(sVar7 * uVar39 * sVar8 + (long)pvVar9);
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var4)) {
                    pfVar31 = pfVar35;
                    iVar40 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                    do {
                      auVar51._0_4_ = *pfVar43 * *pfVar31;
                      auVar51._4_4_ = pfVar43[1] * pfVar31[1];
                      auVar51._8_4_ = pfVar43[2] * pfVar31[2];
                      auVar51._12_4_ = pfVar43[3] * pfVar31[3];
                      auVar136 = vshufpd_avx(auVar51,auVar51,1);
                      auVar52._0_4_ = auVar136._0_4_ + auVar51._0_4_;
                      auVar52._4_4_ = auVar136._4_4_ + auVar51._4_4_;
                      auVar52._8_4_ = auVar136._8_4_ + auVar51._8_4_;
                      auVar52._12_4_ = auVar136._12_4_ + auVar51._12_4_;
                      auVar136 = vmovshdup_avx(auVar52);
                      auVar86 = ZEXT464((uint)(auVar136._0_4_ + auVar86._0_4_ + auVar52._0_4_));
                      pfVar43 = pfVar43 + 4;
                      pfVar31 = pfVar31 + (*(int *)(&this->field_0xd8 + (long)p_Var4) << 2);
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  auVar136 = auVar86._0_16_;
                  uVar36 = uVar36 + 1;
                  pfVar35 = (float *)((long)pfVar35 + lVar44);
                } while (uVar36 != uVar41);
              }
              p_Var4 = pp_Var5[-3];
              fVar60 = auVar136._0_4_;
              fVar46 = fVar60;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar136 = vmaxss_avx(auVar136,ZEXT416(0));
                fVar46 = auVar136._0_4_;
                break;
              case 2:
                auVar136 = vcmpss_avx(ZEXT816(0) << 0x40,auVar136,1);
                auVar115._8_4_ = 0x3f800000;
                auVar115._0_8_ = 0x3f8000003f800000;
                auVar115._12_4_ = 0x3f800000;
                auVar136 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar115,auVar136);
                fVar88 = auVar136._0_4_;
LAB_003153c0:
                fVar46 = fVar88 * fVar60;
                break;
              case 3:
                auVar136 = vmaxss_avx(auVar136,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                auVar136 = vminss_avx(auVar136,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                       )[1]));
                fVar46 = auVar136._0_4_;
                break;
              case 4:
                fVar46 = expf(-fVar60);
                fVar46 = 1.0 / (fVar46 + 1.0);
                break;
              case 5:
                local_48 = auVar136;
                fVar46 = expf(fVar60);
                fVar46 = logf(fVar46 + 1.0);
                fVar46 = tanhf(fVar46);
                fVar46 = fVar46 * (float)local_48._0_4_;
                break;
              case 6:
                fVar87 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar88 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar190 = -fVar88 / fVar87;
                fVar46 = 0.0;
                if ((fVar190 <= fVar60) && (fVar46 = fVar60, fVar60 <= fVar190 + 1.0 / fVar87)) {
                  fVar88 = fVar87 * fVar60 + fVar88;
                  goto LAB_003153c0;
                }
              }
              *(float *)((long)pvVar26 + uVar34 * 4 + lVar29) = fVar46;
              uVar34 = uVar34 + 1;
              iVar42 = iVar42 + 4;
            } while (uVar34 != local_50);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != local_58);
      }
      if ((uVar30 == 0 && uVar2 == 1) && 0 < (int)_h) {
        pvVar10 = top_blob->data;
        local_48._0_8_ = (long)top_blob->w * top_blob->elemsize;
        pp_Var5 = this->_vptr_Convolution1D_x86_avx;
        uVar39 = 0;
        do {
          pvVar26 = local_b8.data;
          if (-1 < iVar3) {
            lVar29 = local_48._0_8_ * uVar39;
            lVar44 = (long)local_b8.w * local_b8.elemsize;
            uVar34 = 0;
            do {
              p_Var4 = pp_Var5[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var4) == 0) {
                auVar86 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar86 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var4) +
                                           uVar39 * 4));
              }
              auVar136 = auVar86._0_16_;
              if (0 < iVar27) {
                iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var4);
                pfVar43 = (float *)((long)((int)uVar39 * iVar27 * iVar42) * 4 +
                                   *(long *)(&this->field_0x148 + (long)p_Var4));
                pfVar35 = (float *)((long)(_func_int ***)pvVar26 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var4) * (int)uVar34)
                                   * 4);
                uVar36 = 0;
                do {
                  if (0 < iVar42) {
                    pfVar31 = pfVar35;
                    iVar40 = iVar42;
                    do {
                      auVar86 = ZEXT464((uint)(*pfVar43 * *pfVar31 + auVar86._0_4_));
                      pfVar43 = pfVar43 + 1;
                      pfVar31 = pfVar31 + *(int *)(&this->field_0xd8 + (long)p_Var4);
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  auVar136 = auVar86._0_16_;
                  uVar36 = uVar36 + 1;
                  pfVar35 = (float *)((long)pfVar35 + lVar44);
                } while (uVar36 != uVar41);
              }
              fVar60 = auVar136._0_4_;
              fVar46 = fVar60;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var4)) {
              case 1:
                auVar136 = vmaxss_avx(auVar136,ZEXT416(0));
                fVar46 = auVar136._0_4_;
                break;
              case 2:
                auVar136 = vcmpss_avx(ZEXT816(0) << 0x40,auVar136,1);
                auVar116._8_4_ = 0x3f800000;
                auVar116._0_8_ = 0x3f8000003f800000;
                auVar116._12_4_ = 0x3f800000;
                auVar136 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)),
                                         auVar116,auVar136);
                fVar88 = auVar136._0_4_;
LAB_00315639:
                fVar46 = fVar88 * fVar60;
                break;
              case 3:
                auVar136 = vmaxss_avx(auVar136,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                      ));
                auVar136 = vminss_avx(auVar136,ZEXT416((*(uint **)(&this->field_0xf8 + (long)p_Var4)
                                                       )[1]));
                fVar46 = auVar136._0_4_;
                break;
              case 4:
                fVar46 = expf(-fVar60);
                fVar46 = 1.0 / (fVar46 + 1.0);
                break;
              case 5:
                fVar46 = expf(fVar60);
                fVar46 = logf(fVar46 + 1.0);
                fVar46 = tanhf(fVar46);
                fVar46 = fVar46 * fVar60;
                break;
              case 6:
                fVar87 = **(float **)(&this->field_0xf8 + (long)p_Var4);
                fVar88 = (*(float **)(&this->field_0xf8 + (long)p_Var4))[1];
                fVar190 = -fVar88 / fVar87;
                fVar46 = 0.0;
                if ((fVar190 <= fVar60) && (fVar46 = fVar60, fVar60 <= fVar190 + 1.0 / fVar87)) {
                  fVar88 = fVar87 * fVar60 + fVar88;
                  goto LAB_00315639;
                }
              }
              *(float *)((long)pvVar10 + uVar34 * 4 + lVar29) = fVar46;
              uVar34 = uVar34 + 1;
            } while (uVar34 != local_50);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != _h);
      }
      iVar40 = 0;
    }
  }
  piVar25 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
  if (piVar25 != (int *)0x0) {
    LOCK();
    *piVar25 = *piVar25 + -1;
    UNLOCK();
    if (*piVar25 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_b8.data != (Allocator *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar40;
}

Assistant:

int Convolution1D_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}